

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx512::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined8 uVar21;
  undefined8 uVar22;
  ulong uVar23;
  undefined8 uVar24;
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  byte bVar57;
  byte bVar58;
  byte bVar59;
  uint uVar60;
  long lVar61;
  long lVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  uint uVar66;
  uint uVar120;
  uint uVar121;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  uint uVar123;
  uint uVar124;
  uint uVar125;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  uint uVar122;
  uint uVar126;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar127;
  undefined4 uVar128;
  float fVar149;
  float fVar150;
  vint4 bi_2;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar133 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar173;
  float fVar194;
  float fVar195;
  vint4 bi;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar196;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar210 [32];
  float fVar214;
  float fVar222;
  float fVar223;
  vint4 ai_2;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar224;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar225;
  vint4 ai_1;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [64];
  vint4 ai;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  float fVar243;
  float fVar247;
  float fVar248;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar249;
  undefined1 auVar246 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  float fVar253;
  undefined1 auVar252 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [64];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [64];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_8d8;
  undefined2 local_8d2;
  ulong local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [16];
  undefined1 local_890 [8];
  float fStack_888;
  float fStack_884;
  RTCFilterFunctionNArguments local_880;
  undefined4 local_84c;
  uint local_848;
  int local_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined8 local_610;
  float local_608;
  float local_604;
  undefined4 local_600;
  uint local_5fc;
  uint local_5f8;
  uint local_5f4;
  uint local_5f0;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  Primitive *local_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 auStack_410 [16];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  
  PVar4 = prim[1];
  uVar64 = (ulong)(byte)PVar4;
  lVar62 = uVar64 * 0x25;
  fVar243 = *(float *)(prim + lVar62 + 0x12);
  auVar74 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar62 + 6));
  auVar174._0_4_ = fVar243 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar174._4_4_ = fVar243 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar174._8_4_ = fVar243 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar174._12_4_ = fVar243 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 4 + 6)));
  auVar215._0_4_ = fVar243 * auVar74._0_4_;
  auVar215._4_4_ = fVar243 * auVar74._4_4_;
  auVar215._8_4_ = fVar243 * auVar74._8_4_;
  auVar215._12_4_ = fVar243 * auVar74._12_4_;
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 5 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 6 + 6)));
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0xf + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar4 * 0x10 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar64 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1a + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1b + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1c + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar226._4_4_ = auVar174._0_4_;
  auVar226._0_4_ = auVar174._0_4_;
  auVar226._8_4_ = auVar174._0_4_;
  auVar226._12_4_ = auVar174._0_4_;
  auVar19 = vshufps_avx(auVar174,auVar174,0x55);
  auVar78 = vshufps_avx(auVar174,auVar174,0xaa);
  fVar243 = auVar78._0_4_;
  auVar175._0_4_ = fVar243 * auVar68._0_4_;
  fVar247 = auVar78._4_4_;
  auVar175._4_4_ = fVar247 * auVar68._4_4_;
  fVar248 = auVar78._8_4_;
  auVar175._8_4_ = fVar248 * auVar68._8_4_;
  fVar249 = auVar78._12_4_;
  auVar175._12_4_ = fVar249 * auVar68._12_4_;
  auVar155._0_4_ = auVar69._0_4_ * fVar243;
  auVar155._4_4_ = auVar69._4_4_ * fVar247;
  auVar155._8_4_ = auVar69._8_4_ * fVar248;
  auVar155._12_4_ = auVar69._12_4_ * fVar249;
  auVar129._0_4_ = auVar70._0_4_ * fVar243;
  auVar129._4_4_ = auVar70._4_4_ * fVar247;
  auVar129._8_4_ = auVar70._8_4_ * fVar248;
  auVar129._12_4_ = auVar70._12_4_ * fVar249;
  auVar78 = vfmadd231ps_fma(auVar175,auVar19,auVar74);
  auVar27 = vfmadd231ps_fma(auVar155,auVar19,auVar79);
  auVar19 = vfmadd231ps_fma(auVar129,auVar77,auVar19);
  auVar78 = vfmadd231ps_fma(auVar78,auVar226,auVar75);
  auVar27 = vfmadd231ps_fma(auVar27,auVar226,auVar80);
  auVar28 = vfmadd231ps_fma(auVar19,auVar76,auVar226);
  auVar260._4_4_ = auVar215._0_4_;
  auVar260._0_4_ = auVar215._0_4_;
  auVar260._8_4_ = auVar215._0_4_;
  auVar260._12_4_ = auVar215._0_4_;
  auVar19 = vshufps_avx(auVar215,auVar215,0x55);
  auVar67 = vshufps_avx512vl(auVar215,auVar215,0xaa);
  auVar68 = vmulps_avx512vl(auVar67,auVar68);
  auVar69 = vmulps_avx512vl(auVar67,auVar69);
  auVar70 = vmulps_avx512vl(auVar67,auVar70);
  auVar74 = vfmadd231ps_fma(auVar68,auVar19,auVar74);
  auVar68 = vfmadd231ps_fma(auVar69,auVar19,auVar79);
  auVar79 = vfmadd231ps_fma(auVar70,auVar19,auVar77);
  auVar29 = vfmadd231ps_fma(auVar74,auVar260,auVar75);
  auVar129 = vfmadd231ps_fma(auVar68,auVar260,auVar80);
  auVar244._8_4_ = 0x7fffffff;
  auVar244._0_8_ = 0x7fffffff7fffffff;
  auVar244._12_4_ = 0x7fffffff;
  auVar130 = vfmadd231ps_fma(auVar79,auVar260,auVar76);
  auVar75 = vandps_avx(auVar244,auVar78);
  auVar236._8_4_ = 0x219392ef;
  auVar236._0_8_ = 0x219392ef219392ef;
  auVar236._12_4_ = 0x219392ef;
  uVar63 = vcmpps_avx512vl(auVar75,auVar236,1);
  bVar10 = (bool)((byte)uVar63 & 1);
  auVar71._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar78._0_4_;
  bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar78._4_4_;
  bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar78._8_4_;
  bVar10 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar78._12_4_;
  auVar75 = vandps_avx(auVar244,auVar27);
  uVar63 = vcmpps_avx512vl(auVar75,auVar236,1);
  bVar10 = (bool)((byte)uVar63 & 1);
  auVar72._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar27._0_4_;
  bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar27._4_4_;
  bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar27._8_4_;
  bVar10 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar27._12_4_;
  auVar75 = vandps_avx(auVar244,auVar28);
  uVar63 = vcmpps_avx512vl(auVar75,auVar236,1);
  bVar10 = (bool)((byte)uVar63 & 1);
  auVar73._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar28._0_4_;
  bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar28._4_4_;
  bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar28._8_4_;
  bVar10 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar28._12_4_;
  auVar74 = vrcp14ps_avx512vl(auVar71);
  auVar237._8_4_ = 0x3f800000;
  auVar237._0_8_ = 0x3f8000003f800000;
  auVar237._12_4_ = 0x3f800000;
  auVar75 = vfnmadd213ps_fma(auVar71,auVar74,auVar237);
  auVar28 = vfmadd132ps_fma(auVar75,auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar72);
  auVar75 = vfnmadd213ps_fma(auVar72,auVar74,auVar237);
  auVar67 = vfmadd132ps_fma(auVar75,auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar73);
  auVar75 = vfnmadd213ps_fma(auVar73,auVar74,auVar237);
  auVar26 = vfmadd132ps_fma(auVar75,auVar74,auVar74);
  fVar243 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar62 + 0x16)) *
            *(float *)(prim + lVar62 + 0x1a);
  auVar233._4_4_ = fVar243;
  auVar233._0_4_ = fVar243;
  auVar233._8_4_ = fVar243;
  auVar233._12_4_ = fVar243;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar64 * 7 + 6);
  auVar75 = vpmovsxwd_avx(auVar75);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar64 * 0xb + 6);
  auVar74 = vpmovsxwd_avx(auVar74);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar80 = vsubps_avx(auVar74,auVar75);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar64 * 9 + 6);
  auVar74 = vpmovsxwd_avx(auVar68);
  auVar68 = vfmadd213ps_fma(auVar80,auVar233,auVar75);
  auVar75 = vcvtdq2ps_avx(auVar74);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar64 * 0xd + 6);
  auVar74 = vpmovsxwd_avx(auVar80);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar80 = vfmadd213ps_fma(auVar74,auVar233,auVar75);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar64 * 0x12 + 6);
  auVar75 = vpmovsxwd_avx(auVar79);
  auVar75 = vcvtdq2ps_avx(auVar75);
  uVar63 = (ulong)(uint)((int)(uVar64 * 5) << 2);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar64 * 2 + uVar63 + 6);
  auVar74 = vpmovsxwd_avx(auVar69);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar79 = vfmadd213ps_fma(auVar74,auVar233,auVar75);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar63 + 6);
  auVar75 = vpmovsxwd_avx(auVar76);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar64 * 0x18 + 6);
  auVar74 = vpmovsxwd_avx(auVar77);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar69 = vfmadd213ps_fma(auVar74,auVar233,auVar75);
  auVar256 = ZEXT1664(auVar69);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar64 * 0x1d + 6);
  auVar75 = vpmovsxwd_avx(auVar70);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar64 + (ulong)(byte)PVar4 * 0x20 + 6);
  auVar74 = vpmovsxwd_avx(auVar19);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar76 = vfmadd213ps_fma(auVar74,auVar233,auVar75);
  auVar259 = ZEXT1664(auVar76);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar4 * 0x20 - uVar64) + 6);
  auVar75 = vpmovsxwd_avx(auVar78);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar64 * 0x23 + 6);
  auVar74 = vpmovsxwd_avx(auVar27);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar74 = vfmadd213ps_fma(auVar74,auVar233,auVar75);
  auVar75 = vsubps_avx(auVar68,auVar29);
  auVar234._0_4_ = auVar28._0_4_ * auVar75._0_4_;
  auVar234._4_4_ = auVar28._4_4_ * auVar75._4_4_;
  auVar234._8_4_ = auVar28._8_4_ * auVar75._8_4_;
  auVar234._12_4_ = auVar28._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar80,auVar29);
  auVar176._0_4_ = auVar28._0_4_ * auVar75._0_4_;
  auVar176._4_4_ = auVar28._4_4_ * auVar75._4_4_;
  auVar176._8_4_ = auVar28._8_4_ * auVar75._8_4_;
  auVar176._12_4_ = auVar28._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar79,auVar129);
  auVar227._0_4_ = auVar67._0_4_ * auVar75._0_4_;
  auVar227._4_4_ = auVar67._4_4_ * auVar75._4_4_;
  auVar227._8_4_ = auVar67._8_4_ * auVar75._8_4_;
  auVar227._12_4_ = auVar67._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar69,auVar129);
  auVar156._0_4_ = auVar67._0_4_ * auVar75._0_4_;
  auVar156._4_4_ = auVar67._4_4_ * auVar75._4_4_;
  auVar156._8_4_ = auVar67._8_4_ * auVar75._8_4_;
  auVar156._12_4_ = auVar67._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar76,auVar130);
  auVar216._0_4_ = auVar26._0_4_ * auVar75._0_4_;
  auVar216._4_4_ = auVar26._4_4_ * auVar75._4_4_;
  auVar216._8_4_ = auVar26._8_4_ * auVar75._8_4_;
  auVar216._12_4_ = auVar26._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar74,auVar130);
  auVar130._0_4_ = auVar26._0_4_ * auVar75._0_4_;
  auVar130._4_4_ = auVar26._4_4_ * auVar75._4_4_;
  auVar130._8_4_ = auVar26._8_4_ * auVar75._8_4_;
  auVar130._12_4_ = auVar26._12_4_ * auVar75._12_4_;
  auVar75 = vpminsd_avx(auVar234,auVar176);
  auVar74 = vpminsd_avx(auVar227,auVar156);
  auVar75 = vmaxps_avx(auVar75,auVar74);
  auVar74 = vpminsd_avx(auVar216,auVar130);
  uVar128 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar28._4_4_ = uVar128;
  auVar28._0_4_ = uVar128;
  auVar28._8_4_ = uVar128;
  auVar28._12_4_ = uVar128;
  auVar74 = vmaxps_avx512vl(auVar74,auVar28);
  auVar75 = vmaxps_avx(auVar75,auVar74);
  auVar67._8_4_ = 0x3f7ffffa;
  auVar67._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar67._12_4_ = 0x3f7ffffa;
  local_380 = vmulps_avx512vl(auVar75,auVar67);
  auVar75 = vpmaxsd_avx(auVar234,auVar176);
  auVar74 = vpmaxsd_avx(auVar227,auVar156);
  auVar75 = vminps_avx(auVar75,auVar74);
  auVar74 = vpmaxsd_avx(auVar216,auVar130);
  fVar243 = (ray->super_RayK<1>).tfar;
  auVar26._4_4_ = fVar243;
  auVar26._0_4_ = fVar243;
  auVar26._8_4_ = fVar243;
  auVar26._12_4_ = fVar243;
  auVar74 = vminps_avx512vl(auVar74,auVar26);
  auVar75 = vminps_avx(auVar75,auVar74);
  auVar29._8_4_ = 0x3f800003;
  auVar29._0_8_ = 0x3f8000033f800003;
  auVar29._12_4_ = 0x3f800003;
  auVar75 = vmulps_avx512vl(auVar75,auVar29);
  auVar74 = vpbroadcastd_avx512vl();
  uVar21 = vcmpps_avx512vl(local_380,auVar75,2);
  uVar63 = vpcmpgtd_avx512vl(auVar74,_DAT_01f7fcf0);
  uVar63 = ((byte)uVar21 & 0xf) & uVar63;
  if ((char)uVar63 == '\0') {
    return;
  }
  local_488 = prim;
LAB_01b98f0f:
  lVar62 = 0;
  for (uVar64 = uVar63; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
    lVar62 = lVar62 + 1;
  }
  local_8d0 = (ulong)*(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_8c8 = (ulong)*(uint *)(prim + lVar62 * 4 + 6);
  uVar64 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           (ulong)*(uint *)(prim + lVar62 * 4 + 6) *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar243 = (pGVar5->time_range).lower;
  fVar243 = pGVar5->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar243) /
            ((pGVar5->time_range).upper - fVar243));
  auVar75 = vroundss_avx(ZEXT416((uint)fVar243),ZEXT416((uint)fVar243),9);
  auVar75 = vminss_avx(auVar75,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar75 = vmaxss_avx(ZEXT816(0) << 0x20,auVar75);
  fVar243 = fVar243 - auVar75._0_4_;
  _Var6 = pGVar5[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar61 = (long)(int)auVar75._0_4_ * 0x38;
  lVar62 = *(long *)(_Var6 + 0x10 + lVar61);
  lVar7 = *(long *)(_Var6 + 0x38 + lVar61);
  lVar8 = *(long *)(_Var6 + 0x48 + lVar61);
  pfVar1 = (float *)(lVar7 + uVar64 * lVar8);
  auVar177._0_4_ = fVar243 * *pfVar1;
  auVar177._4_4_ = fVar243 * pfVar1[1];
  auVar177._8_4_ = fVar243 * pfVar1[2];
  auVar177._12_4_ = fVar243 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar64 + 1) * lVar8);
  auVar197._0_4_ = fVar243 * *pfVar1;
  auVar197._4_4_ = fVar243 * pfVar1[1];
  auVar197._8_4_ = fVar243 * pfVar1[2];
  auVar197._12_4_ = fVar243 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar64 + 2) * lVar8);
  auVar217._0_4_ = fVar243 * *pfVar1;
  auVar217._4_4_ = fVar243 * pfVar1[1];
  auVar217._8_4_ = fVar243 * pfVar1[2];
  auVar217._12_4_ = fVar243 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + lVar8 * (uVar64 + 3));
  auVar157._0_4_ = fVar243 * *pfVar1;
  auVar157._4_4_ = fVar243 * pfVar1[1];
  auVar157._8_4_ = fVar243 * pfVar1[2];
  auVar157._12_4_ = fVar243 * pfVar1[3];
  lVar7 = *(long *)(_Var6 + lVar61);
  fVar243 = 1.0 - fVar243;
  auVar131._4_4_ = fVar243;
  auVar131._0_4_ = fVar243;
  auVar131._8_4_ = fVar243;
  auVar131._12_4_ = fVar243;
  auVar68 = vfmadd231ps_fma(auVar177,auVar131,*(undefined1 (*) [16])(lVar7 + lVar62 * uVar64));
  auVar80 = vfmadd231ps_fma(auVar197,auVar131,*(undefined1 (*) [16])(lVar7 + lVar62 * (uVar64 + 1)))
  ;
  auVar79 = vfmadd231ps_fma(auVar217,auVar131,*(undefined1 (*) [16])(lVar7 + lVar62 * (uVar64 + 2)))
  ;
  auVar69 = vfmadd231ps_fma(auVar157,auVar131,*(undefined1 (*) [16])(lVar7 + lVar62 * (uVar64 + 3)))
  ;
  auVar228._0_4_ = auVar68._0_4_ + auVar80._0_4_ + auVar79._0_4_ + auVar69._0_4_;
  auVar228._4_4_ = auVar68._4_4_ + auVar80._4_4_ + auVar79._4_4_ + auVar69._4_4_;
  auVar228._8_4_ = auVar68._8_4_ + auVar80._8_4_ + auVar79._8_4_ + auVar69._8_4_;
  auVar228._12_4_ = auVar68._12_4_ + auVar80._12_4_ + auVar79._12_4_ + auVar69._12_4_;
  aVar2 = (ray->super_RayK<1>).org.field_0;
  aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar30._8_4_ = 0x3e800000;
  auVar30._0_8_ = 0x3e8000003e800000;
  auVar30._12_4_ = 0x3e800000;
  auVar75 = vmulps_avx512vl(auVar228,auVar30);
  auVar75 = vsubps_avx(auVar75,(undefined1  [16])aVar2);
  auVar75 = vdpps_avx(auVar75,(undefined1  [16])aVar3,0x7f);
  auVar74 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar245._4_12_ = ZEXT812(0) << 0x20;
  auVar245._0_4_ = auVar74._0_4_;
  auVar76 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar245);
  auVar74 = vfnmadd213ss_fma(auVar76,auVar74,ZEXT416(0x40000000));
  fVar243 = auVar75._0_4_ * auVar76._0_4_ * auVar74._0_4_;
  local_4e0 = ZEXT416((uint)fVar243);
  auVar229._4_4_ = fVar243;
  auVar229._0_4_ = fVar243;
  auVar229._8_4_ = fVar243;
  auVar229._12_4_ = fVar243;
  fStack_5b0 = fVar243;
  _local_5c0 = auVar229;
  fStack_5ac = fVar243;
  fStack_5a8 = fVar243;
  fStack_5a4 = fVar243;
  auVar75 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar229);
  auVar75 = vblendps_avx(auVar75,ZEXT816(0) << 0x40,8);
  auVar246 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  auVar74 = vsubps_avx(auVar68,auVar75);
  uVar128 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_340._4_4_ = uVar128;
  local_340._0_4_ = uVar128;
  local_340._8_4_ = uVar128;
  local_340._12_4_ = uVar128;
  local_340._16_4_ = uVar128;
  local_340._20_4_ = uVar128;
  local_340._24_4_ = uVar128;
  local_340._28_4_ = uVar128;
  auVar68 = vsubps_avx(auVar79,auVar75);
  local_660 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]));
  auVar270 = ZEXT3264(local_660);
  local_3c0 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
  uStack_3bc = local_3c0;
  uStack_3b8 = local_3c0;
  uStack_3b4 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3ac = local_3c0;
  uStack_3a8 = local_3c0;
  uStack_3a4 = local_3c0;
  auVar80 = vsubps_avx(auVar80,auVar75);
  auVar242 = ZEXT1664(auVar80);
  auVar75 = vsubps_avx(auVar69,auVar75);
  auVar232 = ZEXT1664(auVar75);
  local_780 = vbroadcastss_avx512vl(auVar74);
  auVar268 = ZEXT3264(local_780);
  auVar82._8_4_ = 1;
  auVar82._0_8_ = 0x100000001;
  auVar82._12_4_ = 1;
  auVar82._16_4_ = 1;
  auVar82._20_4_ = 1;
  auVar82._24_4_ = 1;
  auVar82._28_4_ = 1;
  local_540 = ZEXT1632(auVar74);
  local_7a0 = vpermps_avx512vl(auVar82,local_540);
  auVar262 = ZEXT3264(local_7a0);
  auVar83._8_4_ = 2;
  auVar83._0_8_ = 0x200000002;
  auVar83._12_4_ = 2;
  auVar83._16_4_ = 2;
  auVar83._20_4_ = 2;
  auVar83._24_4_ = 2;
  auVar83._28_4_ = 2;
  local_7c0 = vpermps_avx512vl(auVar83,local_540);
  auVar263 = ZEXT3264(local_7c0);
  auVar84._8_4_ = 3;
  auVar84._0_8_ = 0x300000003;
  auVar84._12_4_ = 3;
  auVar84._16_4_ = 3;
  auVar84._20_4_ = 3;
  auVar84._24_4_ = 3;
  auVar84._28_4_ = 3;
  auVar250 = ZEXT3264(auVar84);
  local_6c0 = vpermps_avx512vl(auVar84,local_540);
  auVar264 = ZEXT3264(local_6c0);
  local_7e0 = vbroadcastss_avx512vl(auVar80);
  auVar265 = ZEXT3264(local_7e0);
  local_580 = ZEXT1632(auVar80);
  local_6e0 = vpermps_avx512vl(auVar82,local_580);
  auVar266 = ZEXT3264(local_6e0);
  local_800 = vpermps_avx512vl(auVar83,local_580);
  auVar267 = ZEXT3264(local_800);
  local_820 = vpermps_avx512vl(auVar84,local_580);
  auVar269 = ZEXT3264(local_820);
  local_700 = vbroadcastss_avx512vl(auVar68);
  auVar271 = ZEXT3264(local_700);
  local_560 = ZEXT1632(auVar68);
  local_720 = vpermps_avx512vl(auVar82,local_560);
  auVar272 = ZEXT3264(local_720);
  local_740 = vpermps_avx512vl(auVar83,local_560);
  auVar273 = ZEXT3264(local_740);
  local_840 = vpermps_avx512vl(auVar84,local_560);
  auVar274 = ZEXT3264(local_840);
  local_1e0 = auVar75._0_4_;
  fStack_1dc = local_1e0;
  fStack_1d8 = local_1e0;
  fStack_1d4 = local_1e0;
  fStack_1d0 = local_1e0;
  fStack_1cc = local_1e0;
  fStack_1c8 = local_1e0;
  fStack_1c4 = local_1e0;
  _local_5a0 = ZEXT1632(auVar75);
  local_240 = vpermps_avx512vl(auVar82,_local_5a0);
  local_260 = vpermps_avx2(auVar83,_local_5a0);
  local_280 = vpermps_avx512vl(auVar84,_local_5a0);
  auVar90 = vpermps_avx2(auVar83,ZEXT1632(CONCAT412(aVar3.field_3.w * aVar3.field_3.w,
                                                    CONCAT48(aVar3.z * aVar3.z,
                                                             CONCAT44(aVar3.y * aVar3.y,
                                                                      aVar3.x * aVar3.x)))));
  local_220 = vfmadd231ps_avx512vl(auVar90,local_660,local_660);
  auVar75 = vfmadd231ps_fma(local_220,local_340,local_340);
  local_200 = ZEXT1632(auVar75);
  auVar90._8_4_ = 0x7fffffff;
  auVar90._0_8_ = 0x7fffffff7fffffff;
  auVar90._12_4_ = 0x7fffffff;
  auVar90._16_4_ = 0x7fffffff;
  auVar90._20_4_ = 0x7fffffff;
  auVar90._24_4_ = 0x7fffffff;
  auVar90._28_4_ = 0x7fffffff;
  vandps_avx512vl(ZEXT1632(auVar75),auVar90);
  local_844 = 1;
  uVar60 = 0;
  local_370 = ZEXT816(0x3f80000000000000);
  do {
    auVar75 = vmovshdup_avx(local_370);
    auVar75 = vsubps_avx(auVar75,local_370);
    auVar132._0_4_ = auVar75._0_4_;
    fVar224 = auVar132._0_4_ * 0.04761905;
    uVar128 = local_370._0_4_;
    local_640._4_4_ = uVar128;
    local_640._0_4_ = uVar128;
    local_640._8_4_ = uVar128;
    local_640._12_4_ = uVar128;
    local_640._16_4_ = uVar128;
    local_640._20_4_ = uVar128;
    local_640._24_4_ = uVar128;
    local_640._28_4_ = uVar128;
    auVar132._4_4_ = auVar132._0_4_;
    auVar132._8_4_ = auVar132._0_4_;
    auVar132._12_4_ = auVar132._0_4_;
    local_760._16_4_ = auVar132._0_4_;
    local_760._0_16_ = auVar132;
    local_760._20_4_ = auVar132._0_4_;
    local_760._24_4_ = auVar132._0_4_;
    local_760._28_4_ = auVar132._0_4_;
    auVar75 = vfmadd231ps_fma(local_640,local_760,_DAT_01faff20);
    auVar90 = vsubps_avx(auVar246._0_32_,ZEXT1632(auVar75));
    fVar243 = auVar90._0_4_;
    fVar248 = auVar90._4_4_;
    fVar211 = auVar90._8_4_;
    fVar213 = auVar90._12_4_;
    fVar214 = auVar90._16_4_;
    fVar222 = auVar90._20_4_;
    fVar223 = auVar90._24_4_;
    fVar127 = fVar243 * fVar243 * fVar243;
    fVar149 = fVar248 * fVar248 * fVar248;
    auVar85._4_4_ = fVar149;
    auVar85._0_4_ = fVar127;
    fVar150 = fVar211 * fVar211 * fVar211;
    auVar85._8_4_ = fVar150;
    fVar151 = fVar213 * fVar213 * fVar213;
    auVar85._12_4_ = fVar151;
    fVar152 = fVar214 * fVar214 * fVar214;
    auVar85._16_4_ = fVar152;
    fVar153 = fVar222 * fVar222 * fVar222;
    auVar85._20_4_ = fVar153;
    fVar154 = fVar223 * fVar223 * fVar223;
    auVar85._24_4_ = fVar154;
    auVar85._28_4_ = auVar132._0_4_;
    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar82 = vmulps_avx512vl(auVar85,auVar81);
    fVar247 = auVar75._0_4_;
    fVar249 = auVar75._4_4_;
    fVar212 = auVar75._8_4_;
    fVar225 = auVar75._12_4_;
    fVar173 = fVar247 * fVar247 * fVar247;
    fVar194 = fVar249 * fVar249 * fVar249;
    fVar195 = fVar212 * fVar212 * fVar212;
    fVar196 = fVar225 * fVar225 * fVar225;
    auVar251._0_4_ = fVar247 * fVar243;
    auVar251._4_4_ = fVar249 * fVar248;
    auVar251._8_4_ = fVar212 * fVar211;
    auVar251._12_4_ = fVar225 * fVar213;
    auVar251._16_4_ = fVar214 * 0.0;
    auVar251._20_4_ = fVar222 * 0.0;
    auVar251._28_36_ = auVar250._28_36_;
    auVar251._24_4_ = fVar223 * 0.0;
    auVar83 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar196,CONCAT48(fVar195,CONCAT44(fVar194,fVar173))
                                                )),auVar81);
    fVar253 = auVar83._28_4_ + auVar132._0_4_;
    auVar20._4_4_ = fVar149 * 0.16666667;
    auVar20._0_4_ = fVar127 * 0.16666667;
    auVar20._8_4_ = fVar150 * 0.16666667;
    auVar20._12_4_ = fVar151 * 0.16666667;
    auVar20._16_4_ = fVar152 * 0.16666667;
    auVar20._20_4_ = fVar153 * 0.16666667;
    auVar20._24_4_ = fVar154 * 0.16666667;
    auVar20._28_4_ = fVar253;
    auVar86._4_4_ =
         (auVar251._4_4_ * fVar248 * 12.0 + auVar251._4_4_ * fVar249 * 6.0 + fVar194 + auVar82._4_4_
         ) * 0.16666667;
    auVar86._0_4_ =
         (auVar251._0_4_ * fVar243 * 12.0 + auVar251._0_4_ * fVar247 * 6.0 + fVar173 + auVar82._0_4_
         ) * 0.16666667;
    auVar86._8_4_ =
         (auVar251._8_4_ * fVar211 * 12.0 + auVar251._8_4_ * fVar212 * 6.0 + fVar195 + auVar82._8_4_
         ) * 0.16666667;
    auVar86._12_4_ =
         (auVar251._12_4_ * fVar213 * 12.0 + auVar251._12_4_ * fVar225 * 6.0 +
         fVar196 + auVar82._12_4_) * 0.16666667;
    auVar86._16_4_ =
         (auVar251._16_4_ * fVar214 * 12.0 + auVar251._16_4_ * 0.0 * 6.0 + auVar82._16_4_ + 0.0) *
         0.16666667;
    auVar86._20_4_ =
         (auVar251._20_4_ * fVar222 * 12.0 + auVar251._20_4_ * 0.0 * 6.0 + auVar82._20_4_ + 0.0) *
         0.16666667;
    auVar86._24_4_ =
         (auVar251._24_4_ * fVar223 * 12.0 + auVar251._24_4_ * 0.0 * 6.0 + auVar82._24_4_ + 0.0) *
         0.16666667;
    auVar86._28_4_ = auVar256._28_4_;
    auVar87._4_4_ =
         (auVar83._4_4_ + fVar149 + auVar251._4_4_ * fVar249 * 12.0 + auVar251._4_4_ * fVar248 * 6.0
         ) * 0.16666667;
    auVar87._0_4_ =
         (auVar83._0_4_ + fVar127 + auVar251._0_4_ * fVar247 * 12.0 + auVar251._0_4_ * fVar243 * 6.0
         ) * 0.16666667;
    auVar87._8_4_ =
         (auVar83._8_4_ + fVar150 + auVar251._8_4_ * fVar212 * 12.0 + auVar251._8_4_ * fVar211 * 6.0
         ) * 0.16666667;
    auVar87._12_4_ =
         (auVar83._12_4_ + fVar151 +
         auVar251._12_4_ * fVar225 * 12.0 + auVar251._12_4_ * fVar213 * 6.0) * 0.16666667;
    auVar87._16_4_ =
         (auVar83._16_4_ + fVar152 + auVar251._16_4_ * 0.0 * 12.0 + auVar251._16_4_ * fVar214 * 6.0)
         * 0.16666667;
    auVar87._20_4_ =
         (auVar83._20_4_ + fVar153 + auVar251._20_4_ * 0.0 * 12.0 + auVar251._20_4_ * fVar222 * 6.0)
         * 0.16666667;
    auVar87._24_4_ =
         (auVar83._24_4_ + fVar154 + auVar251._24_4_ * 0.0 * 12.0 + auVar251._24_4_ * fVar223 * 6.0)
         * 0.16666667;
    auVar87._28_4_ = auVar259._28_4_;
    fVar173 = fVar173 * 0.16666667;
    fVar194 = fVar194 * 0.16666667;
    fVar195 = fVar195 * 0.16666667;
    fVar196 = fVar196 * 0.16666667;
    auVar88._28_4_ = fVar253 + auVar256._28_4_ + auVar232._28_4_;
    auVar88._0_28_ = ZEXT1628(CONCAT412(fVar196,CONCAT48(fVar195,CONCAT44(fVar194,fVar173))));
    auVar89._4_4_ = fStack_1dc * fVar194;
    auVar89._0_4_ = local_1e0 * fVar173;
    auVar89._8_4_ = fStack_1d8 * fVar195;
    auVar89._12_4_ = fStack_1d4 * fVar196;
    auVar89._16_4_ = fStack_1d0 * 0.0;
    auVar89._20_4_ = fStack_1cc * 0.0;
    auVar89._24_4_ = fStack_1c8 * 0.0;
    auVar89._28_4_ = 0;
    auVar82 = vmulps_avx512vl(local_240,auVar88);
    auVar91._4_4_ = local_260._4_4_ * fVar194;
    auVar91._0_4_ = local_260._0_4_ * fVar173;
    auVar91._8_4_ = local_260._8_4_ * fVar195;
    auVar91._12_4_ = local_260._12_4_ * fVar196;
    auVar91._16_4_ = local_260._16_4_ * 0.0;
    auVar91._20_4_ = local_260._20_4_ * 0.0;
    auVar91._24_4_ = local_260._24_4_ * 0.0;
    auVar91._28_4_ = auVar132._0_4_;
    auVar83 = vmulps_avx512vl(local_280,auVar88);
    auVar84 = vfmadd231ps_avx512vl(auVar89,auVar87,auVar271._0_32_);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar87,auVar272._0_32_);
    auVar85 = vfmadd231ps_avx512vl(auVar91,auVar87,auVar273._0_32_);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar274._0_32_,auVar87);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar86,auVar265._0_32_);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar86,auVar266._0_32_);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar86,auVar267._0_32_);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar269._0_32_,auVar86);
    auVar86 = vfmadd231ps_avx512vl(auVar84,auVar20,auVar268._0_32_);
    auVar87 = vfmadd231ps_avx512vl(auVar82,auVar20,auVar262._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar85,auVar20,auVar263._0_32_);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar264._0_32_,auVar20);
    auVar89 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar84 = vxorps_avx512vl(auVar90,auVar89);
    auVar82 = vxorps_avx512vl(ZEXT1632(auVar75),auVar89);
    auVar220._0_4_ = auVar82._0_4_ * fVar247;
    auVar220._4_4_ = auVar82._4_4_ * fVar249;
    auVar220._8_4_ = auVar82._8_4_ * fVar212;
    auVar220._12_4_ = auVar82._12_4_ * fVar225;
    auVar220._16_4_ = auVar82._16_4_ * 0.0;
    auVar220._20_4_ = auVar82._20_4_ * 0.0;
    auVar220._24_4_ = auVar82._24_4_ * 0.0;
    auVar220._28_4_ = 0;
    auVar85 = vmulps_avx512vl(auVar251._0_32_,auVar81);
    auVar82 = vsubps_avx(auVar220,auVar85);
    auVar93._4_4_ = auVar84._4_4_ * fVar248 * 0.5;
    auVar93._0_4_ = auVar84._0_4_ * fVar243 * 0.5;
    auVar93._8_4_ = auVar84._8_4_ * fVar211 * 0.5;
    auVar93._12_4_ = auVar84._12_4_ * fVar213 * 0.5;
    auVar93._16_4_ = auVar84._16_4_ * fVar214 * 0.5;
    auVar93._20_4_ = auVar84._20_4_ * fVar222 * 0.5;
    auVar93._24_4_ = auVar84._24_4_ * fVar223 * 0.5;
    auVar93._28_4_ = auVar90._28_4_;
    auVar94._4_4_ = auVar82._4_4_ * 0.5;
    auVar94._0_4_ = auVar82._0_4_ * 0.5;
    auVar94._8_4_ = auVar82._8_4_ * 0.5;
    auVar94._12_4_ = auVar82._12_4_ * 0.5;
    auVar94._16_4_ = auVar82._16_4_ * 0.5;
    auVar94._20_4_ = auVar82._20_4_ * 0.5;
    auVar94._24_4_ = auVar82._24_4_ * 0.5;
    auVar94._28_4_ = auVar82._28_4_;
    auVar95._4_4_ = (auVar85._4_4_ + fVar248 * fVar248) * 0.5;
    auVar95._0_4_ = (auVar85._0_4_ + fVar243 * fVar243) * 0.5;
    auVar95._8_4_ = (auVar85._8_4_ + fVar211 * fVar211) * 0.5;
    auVar95._12_4_ = (auVar85._12_4_ + fVar213 * fVar213) * 0.5;
    auVar95._16_4_ = (auVar85._16_4_ + fVar214 * fVar214) * 0.5;
    auVar95._20_4_ = (auVar85._20_4_ + fVar222 * fVar222) * 0.5;
    auVar95._24_4_ = (auVar85._24_4_ + fVar223 * fVar223) * 0.5;
    auVar95._28_4_ = auVar85._28_4_ + auVar242._28_4_;
    fVar243 = fVar247 * fVar247 * 0.5;
    fVar247 = fVar249 * fVar249 * 0.5;
    fVar248 = fVar212 * fVar212 * 0.5;
    fVar249 = fVar225 * fVar225 * 0.5;
    auVar100._28_4_ = auVar246._28_4_;
    auVar100._0_28_ = ZEXT1628(CONCAT412(fVar249,CONCAT48(fVar248,CONCAT44(fVar247,fVar243))));
    auVar101._4_4_ = fStack_1dc * fVar247;
    auVar101._0_4_ = local_1e0 * fVar243;
    auVar101._8_4_ = fStack_1d8 * fVar248;
    auVar101._12_4_ = fStack_1d4 * fVar249;
    auVar101._16_4_ = fStack_1d0 * 0.0;
    auVar101._20_4_ = fStack_1cc * 0.0;
    auVar101._24_4_ = fStack_1c8 * 0.0;
    auVar101._28_4_ = 0x3f000000;
    auVar90 = vmulps_avx512vl(local_240,auVar100);
    auVar102._4_4_ = fVar247 * local_260._4_4_;
    auVar102._0_4_ = fVar243 * local_260._0_4_;
    auVar102._8_4_ = fVar248 * local_260._8_4_;
    auVar102._12_4_ = fVar249 * local_260._12_4_;
    auVar102._16_4_ = local_260._16_4_ * 0.0;
    auVar102._20_4_ = local_260._20_4_ * 0.0;
    auVar102._24_4_ = local_260._24_4_ * 0.0;
    auVar102._28_4_ = fStack_1c4;
    auVar82 = vmulps_avx512vl(local_280,auVar100);
    auVar84 = vfmadd231ps_avx512vl(auVar101,auVar95,auVar271._0_32_);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar95,auVar272._0_32_);
    auVar85 = vfmadd231ps_avx512vl(auVar102,auVar95,auVar273._0_32_);
    auVar75 = vfmadd231ps_fma(auVar82,auVar274._0_32_,auVar95);
    auVar82 = vfmadd231ps_avx512vl(auVar84,auVar94,auVar265._0_32_);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar94,auVar266._0_32_);
    auVar84 = vfmadd231ps_avx512vl(auVar85,auVar94,auVar267._0_32_);
    auVar85 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar269._0_32_,auVar94);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar93,auVar268._0_32_);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar93,auVar262._0_32_);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar93,auVar263._0_32_);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar264._0_32_,auVar93);
    auVar109._4_4_ = auVar82._4_4_ * fVar224;
    auVar109._0_4_ = auVar82._0_4_ * fVar224;
    auVar109._8_4_ = auVar82._8_4_ * fVar224;
    auVar109._12_4_ = auVar82._12_4_ * fVar224;
    auVar109._16_4_ = auVar82._16_4_ * fVar224;
    auVar109._20_4_ = auVar82._20_4_ * fVar224;
    auVar109._24_4_ = auVar82._24_4_ * fVar224;
    auVar109._28_4_ = auVar274._28_4_;
    auVar108._4_4_ = auVar90._4_4_ * fVar224;
    auVar108._0_4_ = auVar90._0_4_ * fVar224;
    auVar108._8_4_ = auVar90._8_4_ * fVar224;
    auVar108._12_4_ = auVar90._12_4_ * fVar224;
    auVar108._16_4_ = auVar90._16_4_ * fVar224;
    auVar108._20_4_ = auVar90._20_4_ * fVar224;
    auVar108._24_4_ = auVar90._24_4_ * fVar224;
    auVar108._28_4_ = auVar259._28_4_;
    auVar259 = ZEXT3264(auVar108);
    auVar110._4_4_ = auVar84._4_4_ * fVar224;
    auVar110._0_4_ = auVar84._0_4_ * fVar224;
    auVar110._8_4_ = auVar84._8_4_ * fVar224;
    auVar110._12_4_ = auVar84._12_4_ * fVar224;
    auVar110._16_4_ = auVar84._16_4_ * fVar224;
    auVar110._20_4_ = auVar84._20_4_ * fVar224;
    auVar110._24_4_ = auVar84._24_4_ * fVar224;
    auVar110._28_4_ = auVar84._28_4_;
    fVar243 = auVar85._0_4_ * fVar224;
    fVar247 = auVar85._4_4_ * fVar224;
    auVar103._4_4_ = fVar247;
    auVar103._0_4_ = fVar243;
    fVar248 = auVar85._8_4_ * fVar224;
    auVar103._8_4_ = fVar248;
    fVar249 = auVar85._12_4_ * fVar224;
    auVar103._12_4_ = fVar249;
    fVar211 = auVar85._16_4_ * fVar224;
    auVar103._16_4_ = fVar211;
    fVar212 = auVar85._20_4_ * fVar224;
    auVar103._20_4_ = fVar212;
    fVar213 = auVar85._24_4_ * fVar224;
    auVar103._24_4_ = fVar213;
    auVar103._28_4_ = fVar224;
    auVar75 = vxorps_avx512vl(local_240._0_16_,local_240._0_16_);
    local_8c0 = vpermt2ps_avx512vl(auVar86,_DAT_01feed00,ZEXT1632(auVar75));
    _local_480 = vpermt2ps_avx512vl(auVar87,_DAT_01feed00,ZEXT1632(auVar75));
    auVar84 = ZEXT1632(auVar75);
    auVar91 = vpermt2ps_avx512vl(auVar88,_DAT_01feed00,auVar84);
    auVar221._0_4_ = fVar243 + auVar83._0_4_;
    auVar221._4_4_ = fVar247 + auVar83._4_4_;
    auVar221._8_4_ = fVar248 + auVar83._8_4_;
    auVar221._12_4_ = fVar249 + auVar83._12_4_;
    auVar221._16_4_ = fVar211 + auVar83._16_4_;
    auVar221._20_4_ = fVar212 + auVar83._20_4_;
    auVar221._24_4_ = fVar213 + auVar83._24_4_;
    auVar221._28_4_ = fVar224 + auVar83._28_4_;
    auVar90 = vmaxps_avx(auVar83,auVar221);
    auVar82 = vminps_avx(auVar83,auVar221);
    auVar92 = vpermt2ps_avx512vl(auVar83,_DAT_01feed00,auVar84);
    auVar93 = vpermt2ps_avx512vl(auVar109,_DAT_01feed00,auVar84);
    auVar94 = vpermt2ps_avx512vl(auVar108,_DAT_01feed00,auVar84);
    auVar220 = ZEXT1632(auVar75);
    auVar95 = vpermt2ps_avx512vl(auVar110,_DAT_01feed00,auVar220);
    auVar83 = vpermt2ps_avx512vl(auVar103,_DAT_01feed00,auVar220);
    auVar83 = vsubps_avx(auVar92,auVar83);
    auVar84 = vsubps_avx(local_8c0,auVar86);
    auVar242 = ZEXT3264(auVar84);
    auVar85 = vsubps_avx(_local_480,auVar87);
    auVar20 = vsubps_avx(auVar91,auVar88);
    auVar232 = ZEXT3264(auVar20);
    auVar96 = vmulps_avx512vl(auVar85,auVar110);
    auVar96 = vfmsub231ps_avx512vl(auVar96,auVar108,auVar20);
    auVar97 = vmulps_avx512vl(auVar20,auVar109);
    auVar97 = vfmsub231ps_avx512vl(auVar97,auVar110,auVar84);
    auVar98 = vmulps_avx512vl(auVar84,auVar108);
    auVar98 = vfmsub231ps_avx512vl(auVar98,auVar109,auVar85);
    auVar98 = vmulps_avx512vl(auVar98,auVar98);
    auVar97 = vfmadd231ps_avx512vl(auVar98,auVar97,auVar97);
    auVar96 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar96);
    auVar97 = vmulps_avx512vl(auVar20,auVar20);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar85,auVar85);
    auVar98 = vfmadd231ps_avx512vl(auVar97,auVar84,auVar84);
    auVar97 = vrcp14ps_avx512vl(auVar98);
    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar100 = vfnmadd213ps_avx512vl(auVar97,auVar98,auVar99);
    auVar97 = vfmadd132ps_avx512vl(auVar100,auVar97,auVar97);
    auVar96 = vmulps_avx512vl(auVar96,auVar97);
    auVar100 = vmulps_avx512vl(auVar85,auVar95);
    auVar100 = vfmsub231ps_avx512vl(auVar100,auVar94,auVar20);
    auVar101 = vmulps_avx512vl(auVar20,auVar93);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar95,auVar84);
    auVar102 = vmulps_avx512vl(auVar84,auVar94);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar93,auVar85);
    auVar102 = vmulps_avx512vl(auVar102,auVar102);
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar101,auVar101);
    auVar100 = vfmadd231ps_avx512vl(auVar101,auVar100,auVar100);
    auVar97 = vmulps_avx512vl(auVar100,auVar97);
    auVar96 = vmaxps_avx512vl(auVar96,auVar97);
    auVar96 = vsqrtps_avx512vl(auVar96);
    auVar97 = vmaxps_avx512vl(auVar83,auVar92);
    auVar90 = vmaxps_avx512vl(auVar90,auVar97);
    auVar100 = vaddps_avx512vl(auVar96,auVar90);
    auVar90 = vminps_avx(auVar83,auVar92);
    auVar90 = vminps_avx(auVar82,auVar90);
    auVar90 = vsubps_avx512vl(auVar90,auVar96);
    auVar92._8_4_ = 0x3f800002;
    auVar92._0_8_ = 0x3f8000023f800002;
    auVar92._12_4_ = 0x3f800002;
    auVar92._16_4_ = 0x3f800002;
    auVar92._20_4_ = 0x3f800002;
    auVar92._24_4_ = 0x3f800002;
    auVar92._28_4_ = 0x3f800002;
    auVar82 = vmulps_avx512vl(auVar100,auVar92);
    auVar96._8_4_ = 0x3f7ffffc;
    auVar96._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar96._12_4_ = 0x3f7ffffc;
    auVar96._16_4_ = 0x3f7ffffc;
    auVar96._20_4_ = 0x3f7ffffc;
    auVar96._24_4_ = 0x3f7ffffc;
    auVar96._28_4_ = 0x3f7ffffc;
    local_5e0 = vmulps_avx512vl(auVar90,auVar96);
    auVar90 = vmulps_avx512vl(auVar82,auVar82);
    auVar82 = vrsqrt14ps_avx512vl(auVar98);
    auVar97._8_4_ = 0xbf000000;
    auVar97._0_8_ = 0xbf000000bf000000;
    auVar97._12_4_ = 0xbf000000;
    auVar97._16_4_ = 0xbf000000;
    auVar97._20_4_ = 0xbf000000;
    auVar97._24_4_ = 0xbf000000;
    auVar97._28_4_ = 0xbf000000;
    auVar83 = vmulps_avx512vl(auVar98,auVar97);
    fVar243 = auVar82._0_4_;
    fVar247 = auVar82._4_4_;
    fVar248 = auVar82._8_4_;
    fVar249 = auVar82._12_4_;
    fVar211 = auVar82._16_4_;
    fVar212 = auVar82._20_4_;
    fVar213 = auVar82._24_4_;
    auVar104._4_4_ = fVar247 * fVar247 * fVar247 * auVar83._4_4_;
    auVar104._0_4_ = fVar243 * fVar243 * fVar243 * auVar83._0_4_;
    auVar104._8_4_ = fVar248 * fVar248 * fVar248 * auVar83._8_4_;
    auVar104._12_4_ = fVar249 * fVar249 * fVar249 * auVar83._12_4_;
    auVar104._16_4_ = fVar211 * fVar211 * fVar211 * auVar83._16_4_;
    auVar104._20_4_ = fVar212 * fVar212 * fVar212 * auVar83._20_4_;
    auVar104._24_4_ = fVar213 * fVar213 * fVar213 * auVar83._24_4_;
    auVar104._28_4_ = auVar100._28_4_;
    auVar98._8_4_ = 0x3fc00000;
    auVar98._0_8_ = 0x3fc000003fc00000;
    auVar98._12_4_ = 0x3fc00000;
    auVar98._16_4_ = 0x3fc00000;
    auVar98._20_4_ = 0x3fc00000;
    auVar98._24_4_ = 0x3fc00000;
    auVar98._28_4_ = 0x3fc00000;
    auVar82 = vfmadd231ps_avx512vl(auVar104,auVar82,auVar98);
    auVar83 = vmulps_avx512vl(auVar84,auVar82);
    auVar92 = vmulps_avx512vl(auVar85,auVar82);
    auVar96 = vmulps_avx512vl(auVar20,auVar82);
    auVar97 = vsubps_avx512vl(auVar220,auVar86);
    auVar98 = vsubps_avx512vl(auVar220,auVar87);
    auVar100 = vsubps_avx512vl(auVar220,auVar88);
    auVar105._4_4_ = uStack_3bc;
    auVar105._0_4_ = local_3c0;
    auVar105._8_4_ = uStack_3b8;
    auVar105._12_4_ = uStack_3b4;
    auVar105._16_4_ = uStack_3b0;
    auVar105._20_4_ = uStack_3ac;
    auVar105._24_4_ = uStack_3a8;
    auVar105._28_4_ = uStack_3a4;
    auVar101 = vmulps_avx512vl(auVar105,auVar100);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar270._0_32_,auVar98);
    auVar101 = vfmadd231ps_avx512vl(auVar101,local_340,auVar97);
    auVar102 = vmulps_avx512vl(auVar100,auVar100);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,auVar98);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar97,auVar97);
    auVar103 = vmulps_avx512vl(auVar105,auVar96);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar92,auVar270._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar83,local_340);
    auVar96 = vmulps_avx512vl(auVar100,auVar96);
    auVar92 = vfmadd231ps_avx512vl(auVar96,auVar98,auVar92);
    auVar83 = vfmadd231ps_avx512vl(auVar92,auVar97,auVar83);
    auVar92 = vmulps_avx512vl(auVar103,auVar103);
    auVar96 = vsubps_avx512vl(local_200,auVar92);
    auVar104 = vmulps_avx512vl(auVar103,auVar83);
    auVar101 = vsubps_avx512vl(auVar101,auVar104);
    auVar101 = vaddps_avx512vl(auVar101,auVar101);
    auVar104 = vmulps_avx512vl(auVar83,auVar83);
    local_500 = vsubps_avx512vl(auVar102,auVar104);
    auVar90 = vsubps_avx512vl(local_500,auVar90);
    local_520 = vmulps_avx512vl(auVar101,auVar101);
    _local_680 = vmulps_avx512vl(auVar96,auVar81);
    auVar102 = vmulps_avx512vl(_local_680,auVar90);
    auVar102 = vsubps_avx512vl(local_520,auVar102);
    auVar75 = vxorps_avx512vl(auVar81._0_16_,auVar81._0_16_);
    uVar64 = vcmpps_avx512vl(auVar102,auVar220,5);
    bVar57 = (byte)uVar64;
    fVar243 = (float)local_5c0._0_4_;
    fVar247 = (float)local_5c0._4_4_;
    fVar248 = fStack_5b8;
    fVar249 = fStack_5b4;
    fVar211 = fStack_5b0;
    fVar212 = fStack_5ac;
    fVar213 = fStack_5a8;
    fVar225 = fStack_5a4;
    if (bVar57 == 0) {
LAB_01b99c15:
      auVar270 = ZEXT3264(local_660);
      auVar256 = ZEXT3264(auVar109);
      auVar250 = ZEXT3264(_local_480);
      auVar246 = ZEXT3264(auVar99);
      auVar268 = ZEXT3264(local_780);
      auVar262 = ZEXT3264(local_7a0);
      auVar263 = ZEXT3264(local_7c0);
      auVar264 = ZEXT3264(local_6c0);
      auVar265 = ZEXT3264(local_7e0);
      auVar266 = ZEXT3264(local_6e0);
      auVar267 = ZEXT3264(local_800);
      auVar269 = ZEXT3264(local_820);
      auVar271 = ZEXT3264(local_700);
      auVar272 = ZEXT3264(local_720);
      auVar273 = ZEXT3264(local_740);
      auVar274 = ZEXT3264(local_840);
    }
    else {
      auVar104 = _local_680;
      auVar102 = vsqrtps_avx512vl(auVar102);
      auVar105 = vaddps_avx512vl(auVar96,auVar96);
      local_6a0 = vrcp14ps_avx512vl(auVar105);
      auVar99 = vfnmadd213ps_avx512vl(local_6a0,auVar105,auVar99);
      auVar99 = vfmadd132ps_avx512vl(auVar99,local_6a0,local_6a0);
      _local_420 = vxorps_avx512vl(auVar101,auVar89);
      auVar89 = vsubps_avx512vl(_local_420,auVar102);
      auVar89 = vmulps_avx512vl(auVar89,auVar99);
      auVar102 = vsubps_avx512vl(auVar102,auVar101);
      local_400 = vmulps_avx512vl(auVar102,auVar99);
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar102 = vblendmps_avx512vl(auVar102,auVar89);
      auVar106._0_4_ =
           (uint)(bVar57 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar99._0_4_;
      bVar10 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar106._4_4_ = (uint)bVar10 * auVar102._4_4_ | (uint)!bVar10 * auVar99._4_4_;
      bVar10 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar106._8_4_ = (uint)bVar10 * auVar102._8_4_ | (uint)!bVar10 * auVar99._8_4_;
      bVar10 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar106._12_4_ = (uint)bVar10 * auVar102._12_4_ | (uint)!bVar10 * auVar99._12_4_;
      bVar10 = (bool)((byte)(uVar64 >> 4) & 1);
      auVar106._16_4_ = (uint)bVar10 * auVar102._16_4_ | (uint)!bVar10 * auVar99._16_4_;
      bVar10 = (bool)((byte)(uVar64 >> 5) & 1);
      auVar106._20_4_ = (uint)bVar10 * auVar102._20_4_ | (uint)!bVar10 * auVar99._20_4_;
      bVar10 = (bool)((byte)(uVar64 >> 6) & 1);
      auVar106._24_4_ = (uint)bVar10 * auVar102._24_4_ | (uint)!bVar10 * auVar99._24_4_;
      bVar10 = SUB81(uVar64 >> 7,0);
      auVar106._28_4_ = (uint)bVar10 * auVar102._28_4_ | (uint)!bVar10 * auVar99._28_4_;
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar99 = vblendmps_avx512vl(auVar102,local_400);
      auVar107._0_4_ =
           (uint)(bVar57 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar102._0_4_;
      bVar10 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar107._4_4_ = (uint)bVar10 * auVar99._4_4_ | (uint)!bVar10 * auVar102._4_4_;
      bVar10 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar107._8_4_ = (uint)bVar10 * auVar99._8_4_ | (uint)!bVar10 * auVar102._8_4_;
      bVar10 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar107._12_4_ = (uint)bVar10 * auVar99._12_4_ | (uint)!bVar10 * auVar102._12_4_;
      bVar10 = (bool)((byte)(uVar64 >> 4) & 1);
      auVar107._16_4_ = (uint)bVar10 * auVar99._16_4_ | (uint)!bVar10 * auVar102._16_4_;
      bVar10 = (bool)((byte)(uVar64 >> 5) & 1);
      auVar107._20_4_ = (uint)bVar10 * auVar99._20_4_ | (uint)!bVar10 * auVar102._20_4_;
      bVar10 = (bool)((byte)(uVar64 >> 6) & 1);
      auVar107._24_4_ = (uint)bVar10 * auVar99._24_4_ | (uint)!bVar10 * auVar102._24_4_;
      bVar10 = SUB81(uVar64 >> 7,0);
      auVar107._28_4_ = (uint)bVar10 * auVar99._28_4_ | (uint)!bVar10 * auVar102._28_4_;
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar92,auVar102);
      local_440 = vmaxps_avx512vl(local_220,auVar102);
      auVar81._8_4_ = 0x36000000;
      auVar81._0_8_ = 0x3600000036000000;
      auVar81._12_4_ = 0x36000000;
      auVar81._16_4_ = 0x36000000;
      auVar81._20_4_ = 0x36000000;
      auVar81._24_4_ = 0x36000000;
      auVar81._28_4_ = 0x36000000;
      local_460 = vmulps_avx512vl(local_440,auVar81);
      vandps_avx512vl(auVar96,auVar102);
      uVar65 = vcmpps_avx512vl(local_460,local_460,1);
      uVar64 = uVar64 & uVar65;
      bVar59 = (byte)uVar64;
      if (bVar59 != 0) {
        uVar65 = vcmpps_avx512vl(auVar90,ZEXT1632(auVar75),2);
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar96 = vblendmps_avx512vl(auVar90,auVar92);
        bVar11 = (byte)uVar65;
        uVar66 = (uint)(bVar11 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar11 & 1) * local_460._0_4_;
        bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
        uVar120 = (uint)bVar10 * auVar96._4_4_ | (uint)!bVar10 * local_460._4_4_;
        bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
        uVar121 = (uint)bVar10 * auVar96._8_4_ | (uint)!bVar10 * local_460._8_4_;
        bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
        uVar122 = (uint)bVar10 * auVar96._12_4_ | (uint)!bVar10 * local_460._12_4_;
        bVar10 = (bool)((byte)(uVar65 >> 4) & 1);
        uVar123 = (uint)bVar10 * auVar96._16_4_ | (uint)!bVar10 * local_460._16_4_;
        bVar10 = (bool)((byte)(uVar65 >> 5) & 1);
        uVar124 = (uint)bVar10 * auVar96._20_4_ | (uint)!bVar10 * local_460._20_4_;
        bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
        uVar125 = (uint)bVar10 * auVar96._24_4_ | (uint)!bVar10 * local_460._24_4_;
        bVar10 = SUB81(uVar65 >> 7,0);
        uVar126 = (uint)bVar10 * auVar96._28_4_ | (uint)!bVar10 * local_460._28_4_;
        auVar106._0_4_ = (bVar59 & 1) * uVar66 | !(bool)(bVar59 & 1) * auVar106._0_4_;
        bVar10 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar106._4_4_ = bVar10 * uVar120 | !bVar10 * auVar106._4_4_;
        bVar10 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar106._8_4_ = bVar10 * uVar121 | !bVar10 * auVar106._8_4_;
        bVar10 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar106._12_4_ = bVar10 * uVar122 | !bVar10 * auVar106._12_4_;
        bVar10 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar106._16_4_ = bVar10 * uVar123 | !bVar10 * auVar106._16_4_;
        bVar10 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar106._20_4_ = bVar10 * uVar124 | !bVar10 * auVar106._20_4_;
        bVar10 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar106._24_4_ = bVar10 * uVar125 | !bVar10 * auVar106._24_4_;
        bVar10 = SUB81(uVar64 >> 7,0);
        auVar106._28_4_ = bVar10 * uVar126 | !bVar10 * auVar106._28_4_;
        auVar90 = vblendmps_avx512vl(auVar92,auVar90);
        bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar65 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar65 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar65 >> 4) & 1);
        bVar16 = (bool)((byte)(uVar65 >> 5) & 1);
        bVar17 = (bool)((byte)(uVar65 >> 6) & 1);
        bVar18 = SUB81(uVar65 >> 7,0);
        auVar107._0_4_ =
             (uint)(bVar59 & 1) *
             ((uint)(bVar11 & 1) * auVar90._0_4_ | !(bool)(bVar11 & 1) * uVar66) |
             !(bool)(bVar59 & 1) * auVar107._0_4_;
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar107._4_4_ =
             (uint)bVar12 * ((uint)bVar10 * auVar90._4_4_ | !bVar10 * uVar120) |
             !bVar12 * auVar107._4_4_;
        bVar10 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar107._8_4_ =
             (uint)bVar10 * ((uint)bVar13 * auVar90._8_4_ | !bVar13 * uVar121) |
             !bVar10 * auVar107._8_4_;
        bVar10 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar107._12_4_ =
             (uint)bVar10 * ((uint)bVar14 * auVar90._12_4_ | !bVar14 * uVar122) |
             !bVar10 * auVar107._12_4_;
        bVar10 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar107._16_4_ =
             (uint)bVar10 * ((uint)bVar15 * auVar90._16_4_ | !bVar15 * uVar123) |
             !bVar10 * auVar107._16_4_;
        bVar10 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar107._20_4_ =
             (uint)bVar10 * ((uint)bVar16 * auVar90._20_4_ | !bVar16 * uVar124) |
             !bVar10 * auVar107._20_4_;
        bVar10 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar107._24_4_ =
             (uint)bVar10 * ((uint)bVar17 * auVar90._24_4_ | !bVar17 * uVar125) |
             !bVar10 * auVar107._24_4_;
        bVar10 = SUB81(uVar64 >> 7,0);
        auVar107._28_4_ =
             (uint)bVar10 * ((uint)bVar18 * auVar90._28_4_ | !bVar18 * uVar126) |
             !bVar10 * auVar107._28_4_;
        bVar57 = (~bVar59 | bVar11) & bVar57;
      }
      auVar53._4_4_ = uStack_3bc;
      auVar53._0_4_ = local_3c0;
      auVar53._8_4_ = uStack_3b8;
      auVar53._12_4_ = uStack_3b4;
      auVar53._16_4_ = uStack_3b0;
      auVar53._20_4_ = uStack_3ac;
      auVar53._24_4_ = uStack_3a8;
      auVar53._28_4_ = uStack_3a4;
      if ((bVar57 & 0x7f) == 0) {
        auVar99._8_4_ = 0x3f800000;
        auVar99._0_8_ = 0x3f8000003f800000;
        auVar99._12_4_ = 0x3f800000;
        auVar99._16_4_ = 0x3f800000;
        auVar99._20_4_ = 0x3f800000;
        auVar99._24_4_ = 0x3f800000;
        auVar99._28_4_ = 0x3f800000;
        goto LAB_01b99c15;
      }
      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar96 = vxorps_avx512vl(auVar95,auVar92);
      auVar93 = vxorps_avx512vl(auVar93,auVar92);
      auVar94 = vxorps_avx512vl(auVar94,auVar92);
      auVar75 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),local_4e0);
      auVar90 = vbroadcastss_avx512vl(auVar75);
      auVar95 = vmaxps_avx512vl(auVar90,auVar106);
      auVar75 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).tfar),local_4e0);
      auVar90 = vbroadcastss_avx512vl(auVar75);
      auVar102 = vminps_avx512vl(auVar90,auVar107);
      auVar90 = vmulps_avx512vl(auVar110,auVar100);
      auVar90 = vfmadd213ps_avx512vl(auVar98,auVar108,auVar90);
      auVar75 = vfmadd213ps_fma(auVar97,auVar109,auVar90);
      auVar90 = vmulps_avx512vl(auVar53,auVar110);
      auVar270 = ZEXT3264(local_660);
      auVar90 = vfmadd231ps_avx512vl(auVar90,local_660,auVar108);
      auVar97 = vfmadd231ps_avx512vl(auVar90,local_340,auVar109);
      auVar254._8_4_ = 0x7fffffff;
      auVar254._0_8_ = 0x7fffffff7fffffff;
      auVar254._12_4_ = 0x7fffffff;
      auVar254._16_4_ = 0x7fffffff;
      auVar254._20_4_ = 0x7fffffff;
      auVar254._24_4_ = 0x7fffffff;
      auVar254._28_4_ = 0x7fffffff;
      auVar90 = vandps_avx(auVar254,auVar97);
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar21 = vcmpps_avx512vl(auVar90,auVar98,1);
      auVar90 = vxorps_avx512vl(ZEXT1632(auVar75),auVar92);
      auVar100 = vrcp14ps_avx512vl(auVar97);
      auVar108 = vxorps_avx512vl(auVar97,auVar92);
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar109 = vfnmadd213ps_avx512vl(auVar100,auVar97,auVar99);
      auVar75 = vfmadd132ps_fma(auVar109,auVar100,auVar100);
      fVar214 = auVar75._0_4_ * auVar90._0_4_;
      fVar222 = auVar75._4_4_ * auVar90._4_4_;
      auVar41._4_4_ = fVar222;
      auVar41._0_4_ = fVar214;
      fVar223 = auVar75._8_4_ * auVar90._8_4_;
      auVar41._8_4_ = fVar223;
      fVar224 = auVar75._12_4_ * auVar90._12_4_;
      auVar41._12_4_ = fVar224;
      fVar127 = auVar90._16_4_ * 0.0;
      auVar41._16_4_ = fVar127;
      fVar149 = auVar90._20_4_ * 0.0;
      auVar41._20_4_ = fVar149;
      fVar150 = auVar90._24_4_ * 0.0;
      auVar41._24_4_ = fVar150;
      auVar41._28_4_ = auVar90._28_4_;
      uVar22 = vcmpps_avx512vl(auVar97,auVar108,1);
      bVar59 = (byte)uVar21 | (byte)uVar22;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar109 = vblendmps_avx512vl(auVar41,auVar110);
      auVar111._0_4_ =
           (uint)(bVar59 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar100._0_4_;
      bVar10 = (bool)(bVar59 >> 1 & 1);
      auVar111._4_4_ = (uint)bVar10 * auVar109._4_4_ | (uint)!bVar10 * auVar100._4_4_;
      bVar10 = (bool)(bVar59 >> 2 & 1);
      auVar111._8_4_ = (uint)bVar10 * auVar109._8_4_ | (uint)!bVar10 * auVar100._8_4_;
      bVar10 = (bool)(bVar59 >> 3 & 1);
      auVar111._12_4_ = (uint)bVar10 * auVar109._12_4_ | (uint)!bVar10 * auVar100._12_4_;
      bVar10 = (bool)(bVar59 >> 4 & 1);
      auVar111._16_4_ = (uint)bVar10 * auVar109._16_4_ | (uint)!bVar10 * auVar100._16_4_;
      bVar10 = (bool)(bVar59 >> 5 & 1);
      auVar111._20_4_ = (uint)bVar10 * auVar109._20_4_ | (uint)!bVar10 * auVar100._20_4_;
      bVar10 = (bool)(bVar59 >> 6 & 1);
      auVar111._24_4_ = (uint)bVar10 * auVar109._24_4_ | (uint)!bVar10 * auVar100._24_4_;
      auVar111._28_4_ =
           (uint)(bVar59 >> 7) * auVar109._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar100._28_4_;
      auVar109 = vmaxps_avx512vl(auVar95,auVar111);
      uVar22 = vcmpps_avx512vl(auVar97,auVar108,6);
      bVar59 = (byte)uVar21 | (byte)uVar22;
      auVar112._0_4_ = (uint)(bVar59 & 1) * 0x7f800000 | (uint)!(bool)(bVar59 & 1) * (int)fVar214;
      bVar10 = (bool)(bVar59 >> 1 & 1);
      auVar112._4_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar222;
      bVar10 = (bool)(bVar59 >> 2 & 1);
      auVar112._8_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar223;
      bVar10 = (bool)(bVar59 >> 3 & 1);
      auVar112._12_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar224;
      bVar10 = (bool)(bVar59 >> 4 & 1);
      auVar112._16_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar127;
      bVar10 = (bool)(bVar59 >> 5 & 1);
      auVar112._20_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar149;
      bVar10 = (bool)(bVar59 >> 6 & 1);
      auVar112._24_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar150;
      auVar112._28_4_ =
           (uint)(bVar59 >> 7) * 0x7f800000 | (uint)!(bool)(bVar59 >> 7) * auVar90._28_4_;
      auVar90 = vminps_avx512vl(auVar102,auVar112);
      auVar75 = vxorps_avx512vl(auVar102._0_16_,auVar102._0_16_);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar75),local_8c0);
      auVar95 = vsubps_avx512vl(ZEXT1632(auVar75),_local_480);
      auVar100 = ZEXT1632(auVar75);
      auVar91 = vsubps_avx512vl(auVar100,auVar91);
      auVar91 = vmulps_avx512vl(auVar91,auVar96);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar94,auVar95);
      auVar97 = vfmadd231ps_avx512vl(auVar91,auVar93,auVar97);
      auVar96 = vmulps_avx512vl(auVar53,auVar96);
      auVar96 = vfmadd231ps_avx512vl(auVar96,local_660,auVar94);
      auVar96 = vfmadd231ps_avx512vl(auVar96,local_340,auVar93);
      auVar37._8_4_ = 0x7fffffff;
      auVar37._0_8_ = 0x7fffffff7fffffff;
      auVar37._12_4_ = 0x7fffffff;
      auVar37._16_4_ = 0x7fffffff;
      auVar37._20_4_ = 0x7fffffff;
      auVar37._24_4_ = 0x7fffffff;
      auVar37._28_4_ = 0x7fffffff;
      vandps_avx512vl(auVar96,auVar37);
      uVar21 = vcmpps_avx512vl(auVar96,auVar98,1);
      auVar97 = vxorps_avx512vl(auVar97,auVar92);
      auVar98 = vrcp14ps_avx512vl(auVar96);
      auVar92 = vxorps_avx512vl(auVar96,auVar92);
      auVar91 = vfnmadd213ps_avx512vl(auVar98,auVar96,auVar99);
      auVar75 = vfmadd132ps_fma(auVar91,auVar98,auVar98);
      auVar259 = ZEXT1664(auVar75);
      fVar214 = auVar75._0_4_ * auVar97._0_4_;
      fVar222 = auVar75._4_4_ * auVar97._4_4_;
      auVar42._4_4_ = fVar222;
      auVar42._0_4_ = fVar214;
      fVar223 = auVar75._8_4_ * auVar97._8_4_;
      auVar42._8_4_ = fVar223;
      fVar224 = auVar75._12_4_ * auVar97._12_4_;
      auVar42._12_4_ = fVar224;
      fVar127 = auVar97._16_4_ * 0.0;
      auVar42._16_4_ = fVar127;
      fVar149 = auVar97._20_4_ * 0.0;
      auVar42._20_4_ = fVar149;
      fVar150 = auVar97._24_4_ * 0.0;
      auVar42._24_4_ = fVar150;
      auVar42._28_4_ = auVar97._28_4_;
      uVar22 = vcmpps_avx512vl(auVar96,auVar92,1);
      bVar59 = (byte)uVar21 | (byte)uVar22;
      auVar91 = vblendmps_avx512vl(auVar42,auVar110);
      auVar113._0_4_ =
           (uint)(bVar59 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar98._0_4_;
      bVar10 = (bool)(bVar59 >> 1 & 1);
      auVar113._4_4_ = (uint)bVar10 * auVar91._4_4_ | (uint)!bVar10 * auVar98._4_4_;
      bVar10 = (bool)(bVar59 >> 2 & 1);
      auVar113._8_4_ = (uint)bVar10 * auVar91._8_4_ | (uint)!bVar10 * auVar98._8_4_;
      bVar10 = (bool)(bVar59 >> 3 & 1);
      auVar113._12_4_ = (uint)bVar10 * auVar91._12_4_ | (uint)!bVar10 * auVar98._12_4_;
      bVar10 = (bool)(bVar59 >> 4 & 1);
      auVar113._16_4_ = (uint)bVar10 * auVar91._16_4_ | (uint)!bVar10 * auVar98._16_4_;
      bVar10 = (bool)(bVar59 >> 5 & 1);
      auVar113._20_4_ = (uint)bVar10 * auVar91._20_4_ | (uint)!bVar10 * auVar98._20_4_;
      bVar10 = (bool)(bVar59 >> 6 & 1);
      auVar113._24_4_ = (uint)bVar10 * auVar91._24_4_ | (uint)!bVar10 * auVar98._24_4_;
      auVar113._28_4_ =
           (uint)(bVar59 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar98._28_4_;
      _local_480 = vmaxps_avx(auVar109,auVar113);
      uVar22 = vcmpps_avx512vl(auVar96,auVar92,6);
      bVar59 = (byte)uVar21 | (byte)uVar22;
      auVar114._0_4_ = (uint)(bVar59 & 1) * 0x7f800000 | (uint)!(bool)(bVar59 & 1) * (int)fVar214;
      bVar10 = (bool)(bVar59 >> 1 & 1);
      auVar114._4_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar222;
      bVar10 = (bool)(bVar59 >> 2 & 1);
      auVar114._8_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar223;
      bVar10 = (bool)(bVar59 >> 3 & 1);
      auVar114._12_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar224;
      bVar10 = (bool)(bVar59 >> 4 & 1);
      auVar114._16_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar127;
      bVar10 = (bool)(bVar59 >> 5 & 1);
      auVar114._20_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar149;
      bVar10 = (bool)(bVar59 >> 6 & 1);
      auVar114._24_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar150;
      auVar114._28_4_ =
           (uint)(bVar59 >> 7) * 0x7f800000 | (uint)!(bool)(bVar59 >> 7) * auVar97._28_4_;
      local_2c0 = vminps_avx(auVar90,auVar114);
      auVar90 = _local_480;
      uVar21 = vcmpps_avx512vl(_local_480,local_2c0,2);
      bVar57 = bVar57 & 0x7f & (byte)uVar21;
      if (bVar57 == 0) goto LAB_01b99c15;
      auVar96 = vmaxps_avx512vl(auVar100,local_5e0);
      auVar92 = vfmadd213ps_avx512vl(auVar89,auVar103,auVar83);
      auVar92 = vmulps_avx512vl(auVar82,auVar92);
      auVar97 = vfmadd213ps_avx512vl(local_400,auVar103,auVar83);
      fVar214 = auVar82._0_4_;
      fVar222 = auVar82._4_4_;
      auVar43._4_4_ = fVar222 * auVar97._4_4_;
      auVar43._0_4_ = fVar214 * auVar97._0_4_;
      fVar223 = auVar82._8_4_;
      auVar43._8_4_ = fVar223 * auVar97._8_4_;
      fVar224 = auVar82._12_4_;
      auVar43._12_4_ = fVar224 * auVar97._12_4_;
      fVar127 = auVar82._16_4_;
      auVar43._16_4_ = fVar127 * auVar97._16_4_;
      fVar149 = auVar82._20_4_;
      auVar43._20_4_ = fVar149 * auVar97._20_4_;
      fVar150 = auVar82._24_4_;
      auVar43._24_4_ = fVar150 * auVar97._24_4_;
      auVar43._28_4_ = auVar97._28_4_;
      auVar92 = vminps_avx512vl(auVar92,auVar99);
      auVar97 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar92 = vmaxps_avx(auVar92,ZEXT832(0) << 0x20);
      auVar98 = vminps_avx512vl(auVar43,auVar99);
      auVar44._4_4_ = (auVar92._4_4_ + 1.0) * 0.125;
      auVar44._0_4_ = (auVar92._0_4_ + 0.0) * 0.125;
      auVar44._8_4_ = (auVar92._8_4_ + 2.0) * 0.125;
      auVar44._12_4_ = (auVar92._12_4_ + 3.0) * 0.125;
      auVar44._16_4_ = (auVar92._16_4_ + 4.0) * 0.125;
      auVar44._20_4_ = (auVar92._20_4_ + 5.0) * 0.125;
      auVar44._24_4_ = (auVar92._24_4_ + 6.0) * 0.125;
      auVar44._28_4_ = auVar92._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar44,local_760,local_640);
      auVar92 = vmaxps_avx(auVar98,ZEXT832(0) << 0x20);
      auVar45._4_4_ = (auVar92._4_4_ + 1.0) * 0.125;
      auVar45._0_4_ = (auVar92._0_4_ + 0.0) * 0.125;
      auVar45._8_4_ = (auVar92._8_4_ + 2.0) * 0.125;
      auVar45._12_4_ = (auVar92._12_4_ + 3.0) * 0.125;
      auVar45._16_4_ = (auVar92._16_4_ + 4.0) * 0.125;
      auVar45._20_4_ = (auVar92._20_4_ + 5.0) * 0.125;
      auVar45._24_4_ = (auVar92._24_4_ + 6.0) * 0.125;
      auVar45._28_4_ = auVar92._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar45,local_760,local_640);
      auVar46._4_4_ = auVar96._4_4_ * auVar96._4_4_;
      auVar46._0_4_ = auVar96._0_4_ * auVar96._0_4_;
      auVar46._8_4_ = auVar96._8_4_ * auVar96._8_4_;
      auVar46._12_4_ = auVar96._12_4_ * auVar96._12_4_;
      auVar46._16_4_ = auVar96._16_4_ * auVar96._16_4_;
      auVar46._20_4_ = auVar96._20_4_ * auVar96._20_4_;
      auVar46._24_4_ = auVar96._24_4_ * auVar96._24_4_;
      auVar46._28_4_ = auVar96._28_4_;
      auVar92 = vsubps_avx(local_500,auVar46);
      auVar47._4_4_ = auVar92._4_4_ * (float)local_680._4_4_;
      auVar47._0_4_ = auVar92._0_4_ * (float)local_680._0_4_;
      auVar47._8_4_ = auVar92._8_4_ * fStack_678;
      auVar47._12_4_ = auVar92._12_4_ * fStack_674;
      auVar47._16_4_ = auVar92._16_4_ * fStack_670;
      auVar47._20_4_ = auVar92._20_4_ * fStack_66c;
      auVar47._24_4_ = auVar92._24_4_ * fStack_668;
      auVar47._28_4_ = auVar96._28_4_;
      auVar96 = vsubps_avx(local_520,auVar47);
      uVar64 = vcmpps_avx512vl(auVar96,ZEXT832(0) << 0x20,5);
      auVar266 = ZEXT3264(local_6e0);
      auVar271 = ZEXT3264(local_700);
      auVar272 = ZEXT3264(local_720);
      auVar273 = ZEXT3264(local_740);
      if ((byte)uVar64 == 0) {
        uVar64 = 0;
        auVar82 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar259 = ZEXT864(0) << 0x20;
        auVar96 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar250 = ZEXT864(0) << 0x20;
        auVar115._8_4_ = 0x7f800000;
        auVar115._0_8_ = 0x7f8000007f800000;
        auVar115._12_4_ = 0x7f800000;
        auVar115._16_4_ = 0x7f800000;
        auVar115._20_4_ = 0x7f800000;
        auVar115._24_4_ = 0x7f800000;
        auVar115._28_4_ = 0x7f800000;
        auVar116._8_4_ = 0xff800000;
        auVar116._0_8_ = 0xff800000ff800000;
        auVar116._12_4_ = 0xff800000;
        auVar116._16_4_ = 0xff800000;
        auVar116._20_4_ = 0xff800000;
        auVar116._24_4_ = 0xff800000;
        auVar116._28_4_ = 0xff800000;
      }
      else {
        auVar74 = vxorps_avx512vl(auVar132,auVar132);
        uVar65 = vcmpps_avx512vl(auVar96,auVar100,5);
        auVar96 = vsqrtps_avx(auVar96);
        auVar97 = vfnmadd213ps_avx512vl(auVar105,local_6a0,auVar99);
        auVar89 = vfmadd132ps_avx512vl(auVar97,local_6a0,local_6a0);
        auVar97 = vsubps_avx(_local_420,auVar96);
        auVar91 = vmulps_avx512vl(auVar97,auVar89);
        auVar96 = vsubps_avx512vl(auVar96,auVar101);
        auVar89 = vmulps_avx512vl(auVar96,auVar89);
        auVar96 = vfmadd213ps_avx512vl(auVar103,auVar91,auVar83);
        auVar48._4_4_ = fVar222 * auVar96._4_4_;
        auVar48._0_4_ = fVar214 * auVar96._0_4_;
        auVar48._8_4_ = fVar223 * auVar96._8_4_;
        auVar48._12_4_ = fVar224 * auVar96._12_4_;
        auVar48._16_4_ = fVar127 * auVar96._16_4_;
        auVar48._20_4_ = fVar149 * auVar96._20_4_;
        auVar48._24_4_ = fVar150 * auVar96._24_4_;
        auVar48._28_4_ = auVar98._28_4_;
        auVar96 = vmulps_avx512vl(local_340,auVar91);
        auVar97 = vmulps_avx512vl(local_660,auVar91);
        auVar54._4_4_ = uStack_3bc;
        auVar54._0_4_ = local_3c0;
        auVar54._8_4_ = uStack_3b8;
        auVar54._12_4_ = uStack_3b4;
        auVar54._16_4_ = uStack_3b0;
        auVar54._20_4_ = uStack_3ac;
        auVar54._24_4_ = uStack_3a8;
        auVar54._28_4_ = uStack_3a4;
        auVar93 = vmulps_avx512vl(auVar54,auVar91);
        auVar98 = vfmadd213ps_avx512vl(auVar84,auVar48,auVar86);
        auVar96 = vsubps_avx512vl(auVar96,auVar98);
        auVar98 = vfmadd213ps_avx512vl(auVar85,auVar48,auVar87);
        auVar98 = vsubps_avx512vl(auVar97,auVar98);
        auVar75 = vfmadd213ps_fma(auVar48,auVar20,auVar88);
        auVar97 = vsubps_avx(auVar93,ZEXT1632(auVar75));
        auVar250 = ZEXT3264(auVar97);
        auVar83 = vfmadd213ps_avx512vl(auVar103,auVar89,auVar83);
        auVar49._4_4_ = fVar222 * auVar83._4_4_;
        auVar49._0_4_ = fVar214 * auVar83._0_4_;
        auVar49._8_4_ = fVar223 * auVar83._8_4_;
        auVar49._12_4_ = fVar224 * auVar83._12_4_;
        auVar49._16_4_ = fVar127 * auVar83._16_4_;
        auVar49._20_4_ = fVar149 * auVar83._20_4_;
        auVar49._24_4_ = fVar150 * auVar83._24_4_;
        auVar49._28_4_ = auVar82._28_4_;
        auVar82 = vmulps_avx512vl(local_340,auVar89);
        auVar83 = vmulps_avx512vl(local_660,auVar89);
        auVar93 = vmulps_avx512vl(auVar54,auVar89);
        auVar75 = vfmadd213ps_fma(auVar84,auVar49,auVar86);
        auVar97 = vsubps_avx(auVar82,ZEXT1632(auVar75));
        auVar75 = vfmadd213ps_fma(auVar85,auVar49,auVar87);
        auVar82 = vsubps_avx(auVar83,ZEXT1632(auVar75));
        auVar75 = vfmadd213ps_fma(auVar20,auVar49,auVar88);
        auVar83 = vsubps_avx512vl(auVar93,ZEXT1632(auVar75));
        auVar259 = ZEXT3264(auVar83);
        auVar141._8_4_ = 0x7f800000;
        auVar141._0_8_ = 0x7f8000007f800000;
        auVar141._12_4_ = 0x7f800000;
        auVar141._16_4_ = 0x7f800000;
        auVar141._20_4_ = 0x7f800000;
        auVar141._24_4_ = 0x7f800000;
        auVar141._28_4_ = 0x7f800000;
        auVar83 = vblendmps_avx512vl(auVar141,auVar91);
        bVar10 = (bool)((byte)uVar65 & 1);
        auVar115._0_4_ = (uint)bVar10 * auVar83._0_4_ | (uint)!bVar10 * auVar86._0_4_;
        bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar10 * auVar83._4_4_ | (uint)!bVar10 * auVar86._4_4_;
        bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar10 * auVar83._8_4_ | (uint)!bVar10 * auVar86._8_4_;
        bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar10 * auVar83._12_4_ | (uint)!bVar10 * auVar86._12_4_;
        bVar10 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar115._16_4_ = (uint)bVar10 * auVar83._16_4_ | (uint)!bVar10 * auVar86._16_4_;
        bVar10 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar115._20_4_ = (uint)bVar10 * auVar83._20_4_ | (uint)!bVar10 * auVar86._20_4_;
        bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar115._24_4_ = (uint)bVar10 * auVar83._24_4_ | (uint)!bVar10 * auVar86._24_4_;
        bVar10 = SUB81(uVar65 >> 7,0);
        auVar115._28_4_ = (uint)bVar10 * auVar83._28_4_ | (uint)!bVar10 * auVar86._28_4_;
        auVar142._8_4_ = 0xff800000;
        auVar142._0_8_ = 0xff800000ff800000;
        auVar142._12_4_ = 0xff800000;
        auVar142._16_4_ = 0xff800000;
        auVar142._20_4_ = 0xff800000;
        auVar142._24_4_ = 0xff800000;
        auVar142._28_4_ = 0xff800000;
        auVar83 = vblendmps_avx512vl(auVar142,auVar89);
        bVar10 = (bool)((byte)uVar65 & 1);
        auVar116._0_4_ = (uint)bVar10 * auVar83._0_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar116._4_4_ = (uint)bVar10 * auVar83._4_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar116._8_4_ = (uint)bVar10 * auVar83._8_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar116._12_4_ = (uint)bVar10 * auVar83._12_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar116._16_4_ = (uint)bVar10 * auVar83._16_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar116._20_4_ = (uint)bVar10 * auVar83._20_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar116._24_4_ = (uint)bVar10 * auVar83._24_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = SUB81(uVar65 >> 7,0);
        auVar116._28_4_ = (uint)bVar10 * auVar83._28_4_ | (uint)!bVar10 * -0x800000;
        auVar38._8_4_ = 0x36000000;
        auVar38._0_8_ = 0x3600000036000000;
        auVar38._12_4_ = 0x36000000;
        auVar38._16_4_ = 0x36000000;
        auVar38._20_4_ = 0x36000000;
        auVar38._24_4_ = 0x36000000;
        auVar38._28_4_ = 0x36000000;
        auVar83 = vmulps_avx512vl(local_440,auVar38);
        uVar23 = vcmpps_avx512vl(auVar83,local_460,0xe);
        uVar65 = uVar65 & uVar23;
        bVar59 = (byte)uVar65;
        if (bVar59 != 0) {
          uVar23 = vcmpps_avx512vl(auVar92,ZEXT1632(auVar74),2);
          auVar240._8_4_ = 0x7f800000;
          auVar240._0_8_ = 0x7f8000007f800000;
          auVar240._12_4_ = 0x7f800000;
          auVar240._16_4_ = 0x7f800000;
          auVar240._20_4_ = 0x7f800000;
          auVar240._24_4_ = 0x7f800000;
          auVar240._28_4_ = 0x7f800000;
          auVar255._8_4_ = 0xff800000;
          auVar255._0_8_ = 0xff800000ff800000;
          auVar255._12_4_ = 0xff800000;
          auVar255._16_4_ = 0xff800000;
          auVar255._20_4_ = 0xff800000;
          auVar255._24_4_ = 0xff800000;
          auVar255._28_4_ = 0xff800000;
          auVar84 = vblendmps_avx512vl(auVar240,auVar255);
          bVar11 = (byte)uVar23;
          uVar66 = (uint)(bVar11 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar83._0_4_;
          bVar10 = (bool)((byte)(uVar23 >> 1) & 1);
          uVar120 = (uint)bVar10 * auVar84._4_4_ | (uint)!bVar10 * auVar83._4_4_;
          bVar10 = (bool)((byte)(uVar23 >> 2) & 1);
          uVar121 = (uint)bVar10 * auVar84._8_4_ | (uint)!bVar10 * auVar83._8_4_;
          bVar10 = (bool)((byte)(uVar23 >> 3) & 1);
          uVar122 = (uint)bVar10 * auVar84._12_4_ | (uint)!bVar10 * auVar83._12_4_;
          bVar10 = (bool)((byte)(uVar23 >> 4) & 1);
          uVar123 = (uint)bVar10 * auVar84._16_4_ | (uint)!bVar10 * auVar83._16_4_;
          bVar10 = (bool)((byte)(uVar23 >> 5) & 1);
          uVar124 = (uint)bVar10 * auVar84._20_4_ | (uint)!bVar10 * auVar83._20_4_;
          bVar10 = (bool)((byte)(uVar23 >> 6) & 1);
          uVar125 = (uint)bVar10 * auVar84._24_4_ | (uint)!bVar10 * auVar83._24_4_;
          bVar10 = SUB81(uVar23 >> 7,0);
          uVar126 = (uint)bVar10 * auVar84._28_4_ | (uint)!bVar10 * auVar83._28_4_;
          auVar115._0_4_ = (bVar59 & 1) * uVar66 | !(bool)(bVar59 & 1) * auVar115._0_4_;
          bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar115._4_4_ = bVar10 * uVar120 | !bVar10 * auVar115._4_4_;
          bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar115._8_4_ = bVar10 * uVar121 | !bVar10 * auVar115._8_4_;
          bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar115._12_4_ = bVar10 * uVar122 | !bVar10 * auVar115._12_4_;
          bVar10 = (bool)((byte)(uVar65 >> 4) & 1);
          auVar115._16_4_ = bVar10 * uVar123 | !bVar10 * auVar115._16_4_;
          bVar10 = (bool)((byte)(uVar65 >> 5) & 1);
          auVar115._20_4_ = bVar10 * uVar124 | !bVar10 * auVar115._20_4_;
          bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
          auVar115._24_4_ = bVar10 * uVar125 | !bVar10 * auVar115._24_4_;
          bVar10 = SUB81(uVar65 >> 7,0);
          auVar115._28_4_ = bVar10 * uVar126 | !bVar10 * auVar115._28_4_;
          auVar83 = vblendmps_avx512vl(auVar255,auVar240);
          bVar10 = (bool)((byte)(uVar23 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar23 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar23 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar23 >> 4) & 1);
          bVar16 = (bool)((byte)(uVar23 >> 5) & 1);
          bVar17 = (bool)((byte)(uVar23 >> 6) & 1);
          bVar18 = SUB81(uVar23 >> 7,0);
          auVar116._0_4_ =
               (uint)(bVar59 & 1) *
               ((uint)(bVar11 & 1) * auVar83._0_4_ | !(bool)(bVar11 & 1) * uVar66) |
               !(bool)(bVar59 & 1) * auVar116._0_4_;
          bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar116._4_4_ =
               (uint)bVar12 * ((uint)bVar10 * auVar83._4_4_ | !bVar10 * uVar120) |
               !bVar12 * auVar116._4_4_;
          bVar10 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar116._8_4_ =
               (uint)bVar10 * ((uint)bVar13 * auVar83._8_4_ | !bVar13 * uVar121) |
               !bVar10 * auVar116._8_4_;
          bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar116._12_4_ =
               (uint)bVar10 * ((uint)bVar14 * auVar83._12_4_ | !bVar14 * uVar122) |
               !bVar10 * auVar116._12_4_;
          bVar10 = (bool)((byte)(uVar65 >> 4) & 1);
          auVar116._16_4_ =
               (uint)bVar10 * ((uint)bVar15 * auVar83._16_4_ | !bVar15 * uVar123) |
               !bVar10 * auVar116._16_4_;
          bVar10 = (bool)((byte)(uVar65 >> 5) & 1);
          auVar116._20_4_ =
               (uint)bVar10 * ((uint)bVar16 * auVar83._20_4_ | !bVar16 * uVar124) |
               !bVar10 * auVar116._20_4_;
          bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
          auVar116._24_4_ =
               (uint)bVar10 * ((uint)bVar17 * auVar83._24_4_ | !bVar17 * uVar125) |
               !bVar10 * auVar116._24_4_;
          bVar10 = SUB81(uVar65 >> 7,0);
          auVar116._28_4_ =
               (uint)bVar10 * ((uint)bVar18 * auVar83._28_4_ | !bVar18 * uVar126) |
               !bVar10 * auVar116._28_4_;
          uVar64 = (ulong)(byte)((~bVar59 | bVar11) & (byte)uVar64);
        }
      }
      auVar268 = ZEXT3264(local_780);
      auVar262 = ZEXT3264(local_7a0);
      auVar263 = ZEXT3264(local_7c0);
      auVar265 = ZEXT3264(local_7e0);
      auVar267 = ZEXT3264(local_800);
      auVar269 = ZEXT3264(local_820);
      auVar274 = ZEXT3264(local_840);
      uVar128 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar235._4_4_ = uVar128;
      auVar235._0_4_ = uVar128;
      auVar235._8_4_ = uVar128;
      auVar235._12_4_ = uVar128;
      auVar235._16_4_ = uVar128;
      auVar235._20_4_ = uVar128;
      auVar235._24_4_ = uVar128;
      auVar235._28_4_ = uVar128;
      uVar128 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar241._4_4_ = uVar128;
      auVar241._0_4_ = uVar128;
      auVar241._8_4_ = uVar128;
      auVar241._12_4_ = uVar128;
      auVar241._16_4_ = uVar128;
      auVar241._20_4_ = uVar128;
      auVar241._24_4_ = uVar128;
      auVar241._28_4_ = uVar128;
      auVar242 = ZEXT3264(auVar241);
      fVar214 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar256 = ZEXT3264(CONCAT428(fVar214,CONCAT424(fVar214,CONCAT420(fVar214,CONCAT416(fVar214,
                                                  CONCAT412(fVar214,CONCAT48(fVar214,CONCAT44(
                                                  fVar214,fVar214))))))));
      auVar232._0_4_ = fVar214 * auVar259._0_4_;
      auVar232._4_4_ = fVar214 * auVar259._4_4_;
      auVar232._8_4_ = fVar214 * auVar259._8_4_;
      auVar232._12_4_ = fVar214 * auVar259._12_4_;
      auVar232._16_4_ = fVar214 * auVar259._16_4_;
      auVar232._20_4_ = fVar214 * auVar259._20_4_;
      auVar232._28_36_ = auVar259._28_36_;
      auVar232._24_4_ = fVar214 * auVar259._24_4_;
      auVar75 = vfmadd231ps_fma(auVar232._0_32_,auVar241,auVar82);
      auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar235,auVar97);
      auVar259 = ZEXT3264(_local_480);
      _local_320 = _local_480;
      local_300 = vminps_avx(local_2c0,auVar115);
      auVar252._8_4_ = 0x7fffffff;
      auVar252._0_8_ = 0x7fffffff7fffffff;
      auVar252._12_4_ = 0x7fffffff;
      auVar252._16_4_ = 0x7fffffff;
      auVar252._20_4_ = 0x7fffffff;
      auVar252._24_4_ = 0x7fffffff;
      auVar252._28_4_ = 0x7fffffff;
      auVar82 = vandps_avx(auVar252,ZEXT1632(auVar75));
      local_3e0 = vmaxps_avx(_local_480,auVar116);
      auVar232 = ZEXT3264(local_3e0);
      local_2e0 = local_3e0;
      auVar144._8_4_ = 0x3e99999a;
      auVar144._0_8_ = 0x3e99999a3e99999a;
      auVar144._12_4_ = 0x3e99999a;
      auVar144._16_4_ = 0x3e99999a;
      auVar144._20_4_ = 0x3e99999a;
      auVar144._24_4_ = 0x3e99999a;
      auVar144._28_4_ = 0x3e99999a;
      uVar21 = vcmpps_avx512vl(auVar82,auVar144,1);
      local_8d2 = (short)uVar21;
      uVar21 = vcmpps_avx512vl(_local_480,local_300,2);
      bVar59 = (byte)uVar21 & bVar57;
      uVar22 = vcmpps_avx512vl(local_3e0,local_2c0,2);
      auVar264 = ZEXT3264(local_6c0);
      if ((bVar57 & ((byte)uVar22 | (byte)uVar21)) == 0) {
        auVar246 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
      }
      else {
        auVar50._4_4_ = auVar250._4_4_ * fVar214;
        auVar50._0_4_ = auVar250._0_4_ * fVar214;
        auVar50._8_4_ = auVar250._8_4_ * fVar214;
        auVar50._12_4_ = auVar250._12_4_ * fVar214;
        auVar50._16_4_ = auVar250._16_4_ * fVar214;
        auVar50._20_4_ = auVar250._20_4_ * fVar214;
        auVar50._24_4_ = auVar250._24_4_ * fVar214;
        auVar50._28_4_ = 0x3e99999a;
        auVar75 = vfmadd213ps_fma(auVar98,auVar241,auVar50);
        auVar75 = vfmadd213ps_fma(auVar96,auVar235,ZEXT1632(auVar75));
        auVar82 = vandps_avx(auVar252,ZEXT1632(auVar75));
        uVar21 = vcmpps_avx512vl(auVar82,auVar144,1);
        local_84c = (int)CONCAT71((int7)(uVar64 >> 8),~(byte)uVar64);
        bVar11 = (byte)uVar21 | ~(byte)uVar64;
        auVar145._8_4_ = 2;
        auVar145._0_8_ = 0x200000002;
        auVar145._12_4_ = 2;
        auVar145._16_4_ = 2;
        auVar145._20_4_ = 2;
        auVar145._24_4_ = 2;
        auVar145._28_4_ = 2;
        auVar39._8_4_ = 3;
        auVar39._0_8_ = 0x300000003;
        auVar39._12_4_ = 3;
        auVar39._16_4_ = 3;
        auVar39._20_4_ = 3;
        auVar39._24_4_ = 3;
        auVar39._28_4_ = 3;
        auVar82 = vpblendmd_avx512vl(auVar145,auVar39);
        local_2a0._0_4_ = (uint)(bVar11 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar11 & 1) * 2;
        bVar10 = (bool)(bVar11 >> 1 & 1);
        local_2a0._4_4_ = (uint)bVar10 * auVar82._4_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar11 >> 2 & 1);
        local_2a0._8_4_ = (uint)bVar10 * auVar82._8_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar11 >> 3 & 1);
        local_2a0._12_4_ = (uint)bVar10 * auVar82._12_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar11 >> 4 & 1);
        local_2a0._16_4_ = (uint)bVar10 * auVar82._16_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar11 >> 5 & 1);
        local_2a0._20_4_ = (uint)bVar10 * auVar82._20_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar11 >> 6 & 1);
        local_2a0._24_4_ = (uint)bVar10 * auVar82._24_4_ | (uint)!bVar10 * 2;
        local_2a0._28_4_ = (uint)(bVar11 >> 7) * auVar82._28_4_ | (uint)!(bool)(bVar11 >> 7) * 2;
        local_360 = vpbroadcastd_avx512vl();
        uVar21 = vpcmpd_avx512vl(local_360,local_2a0,5);
        local_848 = (uint)bVar59;
        bVar59 = (byte)uVar21 & bVar59;
        _local_680 = auVar104;
        if (bVar59 == 0) {
          fVar243 = (ray->super_RayK<1>).tfar;
          auVar147._4_4_ = fVar243;
          auVar147._0_4_ = fVar243;
          auVar147._8_4_ = fVar243;
          auVar147._12_4_ = fVar243;
          auVar147._16_4_ = fVar243;
          auVar147._20_4_ = fVar243;
          auVar147._24_4_ = fVar243;
          auVar147._28_4_ = fVar243;
        }
        else {
          auVar74 = vminps_avx(local_540._0_16_,local_580._0_16_);
          auVar75 = vmaxps_avx(local_540._0_16_,local_580._0_16_);
          auVar68 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar80 = vminps_avx(auVar74,auVar68);
          auVar74 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar68 = vmaxps_avx(auVar75,auVar74);
          auVar178._8_4_ = 0x7fffffff;
          auVar178._0_8_ = 0x7fffffff7fffffff;
          auVar178._12_4_ = 0x7fffffff;
          auVar75 = vandps_avx(auVar80,auVar178);
          auVar74 = vandps_avx(auVar68,auVar178);
          auVar75 = vmaxps_avx(auVar75,auVar74);
          auVar74 = vmovshdup_avx(auVar75);
          auVar74 = vmaxss_avx(auVar74,auVar75);
          auVar75 = vshufpd_avx(auVar75,auVar75,1);
          auVar75 = vmaxss_avx(auVar75,auVar74);
          fVar243 = auVar75._0_4_ * 1.9073486e-06;
          local_4d0 = vshufps_avx(auVar68,auVar68,0xff);
          local_3a0 = (float)local_480._0_4_ + (float)local_5c0._0_4_;
          fStack_39c = (float)local_480._4_4_ + (float)local_5c0._4_4_;
          fStack_398 = fStack_478 + fStack_5b8;
          fStack_394 = fStack_474 + fStack_5b4;
          fStack_390 = fStack_470 + fStack_5b0;
          fStack_38c = fStack_46c + fStack_5ac;
          fStack_388 = fStack_468 + fStack_5a8;
          fStack_384 = fStack_464 + fStack_5a4;
          _local_480 = auVar90;
          do {
            auVar83 = local_8c0;
            auVar146._8_4_ = 0x7f800000;
            auVar146._0_8_ = 0x7f8000007f800000;
            auVar146._12_4_ = 0x7f800000;
            auVar146._16_4_ = 0x7f800000;
            auVar146._20_4_ = 0x7f800000;
            auVar146._24_4_ = 0x7f800000;
            auVar146._28_4_ = 0x7f800000;
            auVar90 = vblendmps_avx512vl(auVar146,_local_480);
            auVar118._0_4_ =
                 (uint)(bVar59 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar59 & 1) * 0x7f800000;
            bVar10 = (bool)(bVar59 >> 1 & 1);
            auVar118._4_4_ = (uint)bVar10 * auVar90._4_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar59 >> 2 & 1);
            auVar118._8_4_ = (uint)bVar10 * auVar90._8_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar59 >> 3 & 1);
            auVar118._12_4_ = (uint)bVar10 * auVar90._12_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar59 >> 4 & 1);
            auVar118._16_4_ = (uint)bVar10 * auVar90._16_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar59 >> 5 & 1);
            auVar118._20_4_ = (uint)bVar10 * auVar90._20_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar59 >> 6 & 1);
            auVar118._24_4_ = (uint)bVar10 * auVar90._24_4_ | (uint)!bVar10 * 0x7f800000;
            auVar118._28_4_ =
                 (uint)(bVar59 >> 7) * auVar90._28_4_ | (uint)!(bool)(bVar59 >> 7) * 0x7f800000;
            auVar90 = vshufps_avx(auVar118,auVar118,0xb1);
            auVar90 = vminps_avx(auVar118,auVar90);
            auVar82 = vshufpd_avx(auVar90,auVar90,5);
            auVar90 = vminps_avx(auVar90,auVar82);
            auVar82 = vpermpd_avx2(auVar90,0x4e);
            auVar90 = vminps_avx(auVar90,auVar82);
            uVar21 = vcmpps_avx512vl(auVar118,auVar90,0);
            bVar58 = (byte)uVar21 & bVar59;
            bVar11 = bVar59;
            if (bVar58 != 0) {
              bVar11 = bVar58;
            }
            iVar25 = 0;
            for (uVar66 = (uint)bVar11; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
              iVar25 = iVar25 + 1;
            }
            aVar2 = (ray->super_RayK<1>).dir.field_0;
            local_500._0_16_ = (undefined1  [16])aVar2;
            auVar75 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            if (auVar75._0_4_ < 0.0) {
              local_8c0[1] = 0;
              local_8c0[0] = bVar59;
              local_8c0._2_30_ = auVar83._2_30_;
              local_640._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar25 << 2)));
              local_760._0_16_ = ZEXT416(*(uint *)(local_320 + (uint)(iVar25 << 2)));
              fVar247 = sqrtf(auVar75._0_4_);
              bVar59 = local_8c0[0];
              auVar75 = local_760._0_16_;
              auVar74 = local_640._0_16_;
            }
            else {
              auVar75 = vsqrtss_avx(auVar75,auVar75);
              fVar247 = auVar75._0_4_;
              auVar75 = ZEXT416(*(uint *)(local_320 + (uint)(iVar25 << 2)));
              auVar74 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar25 << 2)));
            }
            auVar75 = vinsertps_avx(auVar75,auVar74,0x10);
            auVar250 = ZEXT1664(auVar75);
            lVar62 = 5;
            do {
              uVar128 = auVar250._0_4_;
              auVar134._4_4_ = uVar128;
              auVar134._0_4_ = uVar128;
              auVar134._8_4_ = uVar128;
              auVar134._12_4_ = uVar128;
              auVar74 = vfmadd132ps_fma(auVar134,ZEXT816(0) << 0x40,local_500._0_16_);
              local_520._0_16_ = auVar250._0_16_;
              auVar75 = vmovshdup_avx(auVar250._0_16_);
              fVar213 = auVar75._0_4_;
              fVar212 = 1.0 - fVar213;
              fVar211 = fVar212 * fVar212 * fVar212;
              fVar248 = fVar213 * fVar213;
              fVar225 = fVar248 * fVar213;
              auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar211),
                                        ZEXT416((uint)fVar225));
              fVar249 = fVar213 * fVar212;
              local_640._0_16_ = ZEXT416((uint)fVar212);
              local_8c0._0_16_ = auVar75;
              auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar249 * fVar213 * 6.0)),
                                        ZEXT416((uint)(fVar249 * fVar212)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar225),
                                        ZEXT416((uint)fVar211));
              auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar249 * fVar212 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar249 * fVar213)));
              fVar211 = fVar211 * 0.16666667;
              fVar212 = (auVar68._0_4_ + auVar80._0_4_) * 0.16666667;
              fVar213 = (auVar75._0_4_ + auVar79._0_4_) * 0.16666667;
              fVar225 = fVar225 * 0.16666667;
              auVar179._0_4_ = fVar225 * (float)local_5a0._0_4_;
              auVar179._4_4_ = fVar225 * (float)local_5a0._4_4_;
              auVar179._8_4_ = fVar225 * fStack_598;
              auVar179._12_4_ = fVar225 * fStack_594;
              auVar218._4_4_ = fVar213;
              auVar218._0_4_ = fVar213;
              auVar218._8_4_ = fVar213;
              auVar218._12_4_ = fVar213;
              auVar75 = vfmadd132ps_fma(auVar218,auVar179,local_560._0_16_);
              auVar180._4_4_ = fVar212;
              auVar180._0_4_ = fVar212;
              auVar180._8_4_ = fVar212;
              auVar180._12_4_ = fVar212;
              auVar75 = vfmadd132ps_fma(auVar180,auVar75,local_580._0_16_);
              auVar158._4_4_ = fVar211;
              auVar158._0_4_ = fVar211;
              auVar158._8_4_ = fVar211;
              auVar158._12_4_ = fVar211;
              auVar75 = vfmadd132ps_fma(auVar158,auVar75,local_540._0_16_);
              local_400._0_16_ = auVar75;
              auVar75 = vsubps_avx(auVar74,auVar75);
              local_760._0_16_ = auVar75;
              auVar75 = vdpps_avx(auVar75,auVar75,0x7f);
              local_5e0._0_16_ = auVar75;
              if (auVar75._0_4_ < 0.0) {
                local_680._0_4_ = fVar248;
                local_6a0._0_4_ = fVar249;
                auVar256._0_4_ = sqrtf(auVar75._0_4_);
                auVar256._4_60_ = extraout_var;
                auVar75 = auVar256._0_16_;
                fVar249 = (float)local_6a0._0_4_;
              }
              else {
                auVar75 = vsqrtss_avx(auVar75,auVar75);
                local_680._0_4_ = fVar248;
              }
              local_420._4_4_ = local_640._0_4_;
              local_420._0_4_ = local_420._4_4_;
              fStack_418 = (float)local_420._4_4_;
              fStack_414 = (float)local_420._4_4_;
              auVar68 = vfnmsub213ss_fma(local_8c0._0_16_,local_8c0._0_16_,
                                         ZEXT416((uint)(fVar249 * 4.0)));
              auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar249 * 4.0)),local_640._0_16_,
                                        local_640._0_16_);
              fVar248 = (float)local_420._4_4_ * -(float)local_420._4_4_ * 0.5;
              fVar249 = auVar68._0_4_ * 0.5;
              fVar211 = auVar74._0_4_ * 0.5;
              local_680._0_4_ = (float)local_680._0_4_ * 0.5;
              auVar198._0_4_ = (float)local_680._0_4_ * (float)local_5a0._0_4_;
              auVar198._4_4_ = (float)local_680._0_4_ * (float)local_5a0._4_4_;
              auVar198._8_4_ = (float)local_680._0_4_ * fStack_598;
              auVar198._12_4_ = (float)local_680._0_4_ * fStack_594;
              auVar159._4_4_ = fVar211;
              auVar159._0_4_ = fVar211;
              auVar159._8_4_ = fVar211;
              auVar159._12_4_ = fVar211;
              auVar74 = vfmadd132ps_fma(auVar159,auVar198,local_560._0_16_);
              auVar181._4_4_ = fVar249;
              auVar181._0_4_ = fVar249;
              auVar181._8_4_ = fVar249;
              auVar181._12_4_ = fVar249;
              auVar74 = vfmadd132ps_fma(auVar181,auVar74,local_580._0_16_);
              auVar257._4_4_ = fVar248;
              auVar257._0_4_ = fVar248;
              auVar257._8_4_ = fVar248;
              auVar257._12_4_ = fVar248;
              _local_680 = vfmadd132ps_fma(auVar257,auVar74,local_540._0_16_);
              local_440._0_16_ = vdpps_avx(_local_680,_local_680,0x7f);
              auVar51._12_4_ = 0;
              auVar51._0_12_ = ZEXT812(0);
              fVar248 = local_440._0_4_;
              _local_890 = vrsqrt14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar248));
              fVar249 = local_890._0_4_;
              local_460._0_16_ = vrcp14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar248));
              auVar74 = vfnmadd213ss_fma(local_460._0_16_,local_440._0_16_,ZEXT416(0x40000000));
              local_6a0._0_4_ = auVar75._0_4_;
              if (fVar248 < -fVar248) {
                local_8a0._0_4_ = fVar248 * -0.5;
                fVar211 = sqrtf(fVar248);
                auVar75 = ZEXT416((uint)local_6a0._0_4_);
                fVar248 = (float)local_8a0._0_4_;
                auVar68 = _local_680;
              }
              else {
                auVar68 = vsqrtss_avx(local_440._0_16_,local_440._0_16_);
                fVar211 = auVar68._0_4_;
                fVar248 = fVar248 * -0.5;
                auVar68 = _local_680;
              }
              fVar212 = local_890._0_4_;
              fVar248 = fVar249 * 1.5 + fVar248 * fVar212 * fVar212 * fVar212;
              local_890._0_4_ = auVar68._0_4_ * fVar248;
              local_890._4_4_ = auVar68._4_4_ * fVar248;
              fStack_888 = auVar68._8_4_ * fVar248;
              fStack_884 = auVar68._12_4_ * fVar248;
              auVar80 = vdpps_avx(local_760._0_16_,_local_890,0x7f);
              fVar212 = auVar75._0_4_;
              auVar135._0_4_ = auVar80._0_4_ * auVar80._0_4_;
              auVar135._4_4_ = auVar80._4_4_ * auVar80._4_4_;
              auVar135._8_4_ = auVar80._8_4_ * auVar80._8_4_;
              auVar135._12_4_ = auVar80._12_4_ * auVar80._12_4_;
              auVar79 = vsubps_avx(local_5e0._0_16_,auVar135);
              fVar249 = auVar79._0_4_;
              auVar160._4_12_ = ZEXT812(0) << 0x20;
              auVar160._0_4_ = fVar249;
              auVar69 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar160);
              auVar76 = vmulss_avx512f(auVar69,ZEXT416(0x3fc00000));
              auVar77 = vmulss_avx512f(auVar79,ZEXT416(0xbf000000));
              if (fVar249 < 0.0) {
                local_4b0._0_4_ = auVar77._0_4_;
                local_8a0 = auVar80;
                local_4c0 = fVar248;
                fStack_4bc = fVar248;
                fStack_4b8 = fVar248;
                fStack_4b4 = fVar248;
                local_4a0 = auVar69;
                fVar249 = sqrtf(fVar249);
                auVar77 = ZEXT416((uint)local_4b0._0_4_);
                auVar76 = ZEXT416(auVar76._0_4_);
                auVar75 = ZEXT416((uint)local_6a0._0_4_);
                auVar69 = local_4a0;
                auVar68 = _local_680;
                auVar80 = local_8a0;
                fVar248 = local_4c0;
                fVar213 = fStack_4bc;
                fVar225 = fStack_4b8;
                fVar214 = fStack_4b4;
              }
              else {
                auVar79 = vsqrtss_avx(auVar79,auVar79);
                fVar249 = auVar79._0_4_;
                fVar213 = fVar248;
                fVar225 = fVar248;
                fVar214 = fVar248;
              }
              auVar259 = ZEXT1664(auVar68);
              auVar256 = ZEXT1664(local_5e0._0_16_);
              auVar270 = ZEXT3264(local_660);
              auVar268 = ZEXT3264(local_780);
              auVar262 = ZEXT3264(local_7a0);
              auVar263 = ZEXT3264(local_7c0);
              auVar264 = ZEXT3264(local_6c0);
              auVar265 = ZEXT3264(local_7e0);
              auVar266 = ZEXT3264(local_6e0);
              auVar267 = ZEXT3264(local_800);
              auVar269 = ZEXT3264(local_820);
              auVar271 = ZEXT3264(local_700);
              auVar272 = ZEXT3264(local_720);
              auVar273 = ZEXT3264(local_740);
              auVar274 = ZEXT3264(local_840);
              auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_640._0_16_,
                                        local_8c0._0_16_);
              auVar19 = vfmadd213ss_fma(local_8c0._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                        local_640._0_16_);
              auVar79 = vshufps_avx(local_520._0_16_,local_520._0_16_,0x55);
              auVar182._0_4_ = auVar79._0_4_ * (float)local_5a0._0_4_;
              auVar182._4_4_ = auVar79._4_4_ * (float)local_5a0._4_4_;
              auVar182._8_4_ = auVar79._8_4_ * fStack_598;
              auVar182._12_4_ = auVar79._12_4_ * fStack_594;
              auVar199._0_4_ = auVar19._0_4_;
              auVar199._4_4_ = auVar199._0_4_;
              auVar199._8_4_ = auVar199._0_4_;
              auVar199._12_4_ = auVar199._0_4_;
              auVar79 = vfmadd132ps_fma(auVar199,auVar182,local_560._0_16_);
              auVar161._0_4_ = auVar70._0_4_;
              auVar161._4_4_ = auVar161._0_4_;
              auVar161._8_4_ = auVar161._0_4_;
              auVar161._12_4_ = auVar161._0_4_;
              auVar79 = vfmadd132ps_fma(auVar161,auVar79,local_580._0_16_);
              auVar79 = vfmadd132ps_fma(_local_420,auVar79,local_540._0_16_);
              auVar162._0_4_ = auVar79._0_4_ * (float)local_440._0_4_;
              auVar162._4_4_ = auVar79._4_4_ * (float)local_440._0_4_;
              auVar162._8_4_ = auVar79._8_4_ * (float)local_440._0_4_;
              auVar162._12_4_ = auVar79._12_4_ * (float)local_440._0_4_;
              auVar79 = vdpps_avx(auVar68,auVar79,0x7f);
              fVar222 = auVar79._0_4_;
              auVar183._0_4_ = auVar68._0_4_ * fVar222;
              auVar183._4_4_ = auVar68._4_4_ * fVar222;
              auVar183._8_4_ = auVar68._8_4_ * fVar222;
              auVar183._12_4_ = auVar68._12_4_ * fVar222;
              auVar79 = vsubps_avx(auVar162,auVar183);
              fVar222 = auVar74._0_4_ * (float)local_460._0_4_;
              auVar70 = vmaxss_avx(ZEXT416((uint)fVar243),
                                   ZEXT416((uint)(local_520._0_4_ * fVar247 * 1.9073486e-06)));
              auVar31._8_4_ = 0x80000000;
              auVar31._0_8_ = 0x8000000080000000;
              auVar31._12_4_ = 0x80000000;
              auVar78 = vxorps_avx512vl(auVar68,auVar31);
              auVar184._0_4_ = fVar248 * auVar79._0_4_ * fVar222;
              auVar184._4_4_ = fVar213 * auVar79._4_4_ * fVar222;
              auVar184._8_4_ = fVar225 * auVar79._8_4_ * fVar222;
              auVar184._12_4_ = fVar214 * auVar79._12_4_ * fVar222;
              auVar74 = vdpps_avx(auVar78,_local_890,0x7f);
              auVar79 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar243),auVar70);
              auVar75 = vdpps_avx(local_760._0_16_,auVar184,0x7f);
              auVar19 = vfmadd213ss_fma(ZEXT416((uint)(fVar212 + 1.0)),
                                        ZEXT416((uint)(fVar243 / fVar211)),auVar79);
              fVar248 = auVar74._0_4_ + auVar75._0_4_;
              auVar75 = vdpps_avx(local_500._0_16_,_local_890,0x7f);
              auVar74 = vdpps_avx(local_760._0_16_,auVar78,0x7f);
              auVar79 = vmulss_avx512f(auVar77,auVar69);
              auVar77 = vaddss_avx512f(auVar76,ZEXT416((uint)(auVar79._0_4_ *
                                                             auVar69._0_4_ * auVar69._0_4_)));
              auVar79 = vdpps_avx(local_760._0_16_,local_500._0_16_,0x7f);
              auVar76 = vfnmadd231ss_fma(auVar74,auVar80,ZEXT416((uint)fVar248));
              auVar79 = vfnmadd231ss_fma(auVar79,auVar80,auVar75);
              auVar74 = vpermilps_avx(local_400._0_16_,0xff);
              fVar249 = fVar249 - auVar74._0_4_;
              auVar69 = vshufps_avx(auVar68,auVar68,0xff);
              auVar74 = vfmsub213ss_fma(auVar76,auVar77,auVar69);
              auVar238._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
              auVar238._8_4_ = auVar74._8_4_ ^ 0x80000000;
              auVar238._12_4_ = auVar74._12_4_ ^ 0x80000000;
              auVar242 = ZEXT1664(auVar238);
              auVar79 = ZEXT416((uint)(auVar79._0_4_ * auVar77._0_4_));
              auVar76 = vfmsub231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar74._0_4_)),
                                        ZEXT416((uint)fVar248),auVar79);
              auVar74 = vinsertps_avx(auVar238,auVar79,0x1c);
              auVar230._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
              auVar230._8_4_ = auVar75._8_4_ ^ 0x80000000;
              auVar230._12_4_ = auVar75._12_4_ ^ 0x80000000;
              auVar79 = vinsertps_avx(ZEXT416((uint)fVar248),auVar230,0x10);
              auVar200._0_4_ = auVar76._0_4_;
              auVar200._4_4_ = auVar200._0_4_;
              auVar200._8_4_ = auVar200._0_4_;
              auVar200._12_4_ = auVar200._0_4_;
              auVar75 = vdivps_avx(auVar74,auVar200);
              auVar74 = vdivps_avx(auVar79,auVar200);
              fVar248 = auVar80._0_4_;
              auVar232 = ZEXT1664(CONCAT412(fVar249,CONCAT48(fVar249,CONCAT44(fVar249,fVar249))));
              auVar201._0_4_ = fVar248 * auVar75._0_4_ + fVar249 * auVar74._0_4_;
              auVar201._4_4_ = fVar248 * auVar75._4_4_ + fVar249 * auVar74._4_4_;
              auVar201._8_4_ = fVar248 * auVar75._8_4_ + fVar249 * auVar74._8_4_;
              auVar201._12_4_ = fVar248 * auVar75._12_4_ + fVar249 * auVar74._12_4_;
              auVar75 = vsubps_avx(local_520._0_16_,auVar201);
              auVar250 = ZEXT1664(auVar75);
              auVar32._8_4_ = 0x7fffffff;
              auVar32._0_8_ = 0x7fffffff7fffffff;
              auVar32._12_4_ = 0x7fffffff;
              auVar74 = vandps_avx512vl(auVar80,auVar32);
              if (auVar74._0_4_ < auVar19._0_4_) {
                auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ + auVar70._0_4_)),local_4d0,
                                          ZEXT416(0x36000000));
                auVar33._8_4_ = 0x7fffffff;
                auVar33._0_8_ = 0x7fffffff7fffffff;
                auVar33._12_4_ = 0x7fffffff;
                auVar80 = vandps_avx512vl(ZEXT416((uint)fVar249),auVar33);
                if (auVar80._0_4_ < auVar74._0_4_) {
                  fVar247 = auVar75._0_4_ + (float)local_4e0._0_4_;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar247) &&
                     (fVar248 = (ray->super_RayK<1>).tfar, fVar247 <= fVar248)) {
                    auVar74 = vmovshdup_avx(auVar75);
                    fVar249 = auVar74._0_4_;
                    if ((0.0 <= fVar249) && (fVar249 <= 1.0)) {
                      auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_5e0._0_4_)
                                                  );
                      fVar212 = auVar74._0_4_;
                      fVar211 = local_5e0._0_4_ * -0.5;
                      auVar232 = ZEXT464((uint)fVar211);
                      pGVar5 = (context->scene->geometries).items[local_8d0].ptr;
                      if ((pGVar5->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar211 = fVar212 * 1.5 + fVar211 * fVar212 * fVar212 * fVar212;
                        auVar202._0_4_ = local_760._0_4_ * fVar211;
                        auVar202._4_4_ = local_760._4_4_ * fVar211;
                        auVar202._8_4_ = local_760._8_4_ * fVar211;
                        auVar202._12_4_ = local_760._12_4_ * fVar211;
                        auVar69 = vfmadd213ps_fma(auVar69,auVar202,auVar68);
                        auVar74 = vshufps_avx(auVar202,auVar202,0xc9);
                        auVar80 = vshufps_avx(auVar68,auVar68,0xc9);
                        auVar203._0_4_ = auVar202._0_4_ * auVar80._0_4_;
                        auVar203._4_4_ = auVar202._4_4_ * auVar80._4_4_;
                        auVar203._8_4_ = auVar202._8_4_ * auVar80._8_4_;
                        auVar203._12_4_ = auVar202._12_4_ * auVar80._12_4_;
                        auVar79 = vfmsub231ps_fma(auVar203,auVar68,auVar74);
                        auVar74 = vshufps_avx(auVar79,auVar79,0xc9);
                        auVar80 = vshufps_avx(auVar69,auVar69,0xc9);
                        auVar232 = ZEXT1664(auVar80);
                        auVar79 = vshufps_avx(auVar79,auVar79,0xd2);
                        auVar136._0_4_ = auVar69._0_4_ * auVar79._0_4_;
                        auVar136._4_4_ = auVar69._4_4_ * auVar79._4_4_;
                        auVar136._8_4_ = auVar69._8_4_ * auVar79._8_4_;
                        auVar136._12_4_ = auVar69._12_4_ * auVar79._12_4_;
                        auVar74 = vfmsub231ps_fma(auVar136,auVar74,auVar80);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar247;
                          auVar75 = vshufps_avx(auVar74,auVar74,0xe9);
                          uVar21 = vmovlps_avx(auVar75);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar21;
                          (ray->Ng).field_0.field_0.z = auVar74._0_4_;
                          ray->u = fVar249;
                          ray->v = 0.0;
                          ray->primID = (uint)local_8c8;
                          ray->geomID = (uint)local_8d0;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          local_8c0._0_4_ = fVar248;
                          auVar79 = vshufps_avx(auVar74,auVar74,0xe9);
                          local_610 = vmovlps_avx(auVar79);
                          local_608 = auVar74._0_4_;
                          local_604 = fVar249;
                          local_600 = 0;
                          local_5fc = (uint)local_8c8;
                          local_5f8 = (uint)local_8d0;
                          local_5f4 = context->user->instID[0];
                          local_5f0 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar247;
                          local_8d8 = -1;
                          local_880.valid = &local_8d8;
                          local_880.geometryUserPtr = pGVar5->userPtr;
                          local_880.context = context->user;
                          local_880.ray = (RTCRayN *)ray;
                          local_880.hit = (RTCHitN *)&local_610;
                          local_880.N = 1;
                          if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b9a93c:
                            p_Var9 = context->args->filter;
                            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar232 = ZEXT1664(auVar232._0_16_);
                              auVar242 = ZEXT1664(auVar242._0_16_);
                              auVar250 = ZEXT1664(auVar250._0_16_);
                              auVar256 = ZEXT1664(auVar256._0_16_);
                              auVar259 = ZEXT1664(auVar259._0_16_);
                              (*p_Var9)(&local_880);
                              auVar274 = ZEXT3264(local_840);
                              auVar273 = ZEXT3264(local_740);
                              auVar272 = ZEXT3264(local_720);
                              auVar271 = ZEXT3264(local_700);
                              auVar269 = ZEXT3264(local_820);
                              auVar267 = ZEXT3264(local_800);
                              auVar266 = ZEXT3264(local_6e0);
                              auVar265 = ZEXT3264(local_7e0);
                              auVar264 = ZEXT3264(local_6c0);
                              auVar263 = ZEXT3264(local_7c0);
                              auVar262 = ZEXT3264(local_7a0);
                              auVar268 = ZEXT3264(local_780);
                              auVar270 = ZEXT3264(local_660);
                              if (*local_880.valid == 0) goto LAB_01b9aa42;
                            }
                            (((Vec3f *)((long)local_880.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_880.hit;
                            (((Vec3f *)((long)local_880.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_880.hit + 4);
                            (((Vec3f *)((long)local_880.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_880.hit + 8);
                            *(float *)((long)local_880.ray + 0x3c) = *(float *)(local_880.hit + 0xc)
                            ;
                            *(float *)((long)local_880.ray + 0x40) =
                                 *(float *)(local_880.hit + 0x10);
                            *(float *)((long)local_880.ray + 0x44) =
                                 *(float *)(local_880.hit + 0x14);
                            *(float *)((long)local_880.ray + 0x48) =
                                 *(float *)(local_880.hit + 0x18);
                            *(float *)((long)local_880.ray + 0x4c) =
                                 *(float *)(local_880.hit + 0x1c);
                            *(float *)((long)local_880.ray + 0x50) =
                                 *(float *)(local_880.hit + 0x20);
                          }
                          else {
                            auVar232 = ZEXT1664(auVar80);
                            auVar242 = ZEXT1664(auVar238);
                            auVar250 = ZEXT1664(auVar75);
                            auVar256 = ZEXT1664(local_5e0._0_16_);
                            auVar259 = ZEXT1664(auVar68);
                            (*pGVar5->intersectionFilterN)(&local_880);
                            auVar274 = ZEXT3264(local_840);
                            auVar273 = ZEXT3264(local_740);
                            auVar272 = ZEXT3264(local_720);
                            auVar271 = ZEXT3264(local_700);
                            auVar269 = ZEXT3264(local_820);
                            auVar267 = ZEXT3264(local_800);
                            auVar266 = ZEXT3264(local_6e0);
                            auVar265 = ZEXT3264(local_7e0);
                            auVar264 = ZEXT3264(local_6c0);
                            auVar263 = ZEXT3264(local_7c0);
                            auVar262 = ZEXT3264(local_7a0);
                            auVar268 = ZEXT3264(local_780);
                            auVar270 = ZEXT3264(local_660);
                            if (*local_880.valid != 0) goto LAB_01b9a93c;
LAB_01b9aa42:
                            (ray->super_RayK<1>).tfar = (float)local_8c0._0_4_;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar62 = lVar62 + -1;
            } while (lVar62 != 0);
            fVar247 = (ray->super_RayK<1>).tfar;
            auVar147._4_4_ = fVar247;
            auVar147._0_4_ = fVar247;
            auVar147._8_4_ = fVar247;
            auVar147._12_4_ = fVar247;
            auVar147._16_4_ = fVar247;
            auVar147._20_4_ = fVar247;
            auVar147._24_4_ = fVar247;
            auVar147._28_4_ = fVar247;
            auVar55._4_4_ = fStack_39c;
            auVar55._0_4_ = local_3a0;
            auVar55._8_4_ = fStack_398;
            auVar55._12_4_ = fStack_394;
            auVar55._16_4_ = fStack_390;
            auVar55._20_4_ = fStack_38c;
            auVar55._24_4_ = fStack_388;
            auVar55._28_4_ = fStack_384;
            uVar21 = vcmpps_avx512vl(auVar147,auVar55,0xd);
            bVar59 = ~('\x01' << ((byte)iVar25 & 0x1f)) & bVar59 & (byte)uVar21;
          } while (bVar59 != 0);
        }
        bVar59 = (byte)local_8d2 | (byte)local_84c;
        auVar171._0_4_ = (float)local_5c0._0_4_ + local_3e0._0_4_;
        auVar171._4_4_ = (float)local_5c0._4_4_ + local_3e0._4_4_;
        auVar171._8_4_ = fStack_5b8 + local_3e0._8_4_;
        auVar171._12_4_ = fStack_5b4 + local_3e0._12_4_;
        auVar171._16_4_ = fStack_5b0 + local_3e0._16_4_;
        auVar171._20_4_ = fStack_5ac + local_3e0._20_4_;
        auVar171._24_4_ = fStack_5a8 + local_3e0._24_4_;
        auVar171._28_4_ = fStack_5a4 + local_3e0._28_4_;
        uVar21 = vcmpps_avx512vl(auVar171,auVar147,2);
        bVar57 = (byte)uVar22 & bVar57 & (byte)uVar21;
        auVar172._8_4_ = 2;
        auVar172._0_8_ = 0x200000002;
        auVar172._12_4_ = 2;
        auVar172._16_4_ = 2;
        auVar172._20_4_ = 2;
        auVar172._24_4_ = 2;
        auVar172._28_4_ = 2;
        auVar40._8_4_ = 3;
        auVar40._0_8_ = 0x300000003;
        auVar40._12_4_ = 3;
        auVar40._16_4_ = 3;
        auVar40._20_4_ = 3;
        auVar40._24_4_ = 3;
        auVar40._28_4_ = 3;
        auVar90 = vpblendmd_avx512vl(auVar172,auVar40);
        local_3e0._0_4_ = (uint)(bVar59 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar59 & 1) * 2;
        bVar10 = (bool)(bVar59 >> 1 & 1);
        local_3e0._4_4_ = (uint)bVar10 * auVar90._4_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar59 >> 2 & 1);
        local_3e0._8_4_ = (uint)bVar10 * auVar90._8_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar59 >> 3 & 1);
        local_3e0._12_4_ = (uint)bVar10 * auVar90._12_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar59 >> 4 & 1);
        local_3e0._16_4_ = (uint)bVar10 * auVar90._16_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar59 >> 5 & 1);
        local_3e0._20_4_ = (uint)bVar10 * auVar90._20_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar59 >> 6 & 1);
        local_3e0._24_4_ = (uint)bVar10 * auVar90._24_4_ | (uint)!bVar10 * 2;
        local_3e0._28_4_ = (uint)(bVar59 >> 7) * auVar90._28_4_ | (uint)!(bool)(bVar59 >> 7) * 2;
        uVar21 = vpcmpd_avx512vl(local_360,local_3e0,5);
        bVar59 = (byte)uVar21 & bVar57;
        fVar243 = (float)local_5c0._0_4_;
        fVar247 = (float)local_5c0._4_4_;
        fVar248 = fStack_5b8;
        fVar249 = fStack_5b4;
        fVar211 = fStack_5b0;
        fVar212 = fStack_5ac;
        fVar213 = fStack_5a8;
        fVar225 = fStack_5a4;
        if (bVar59 != 0) {
          auVar74 = vminps_avx(local_540._0_16_,local_580._0_16_);
          auVar75 = vmaxps_avx(local_540._0_16_,local_580._0_16_);
          auVar68 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar80 = vminps_avx(auVar74,auVar68);
          auVar74 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar68 = vmaxps_avx(auVar75,auVar74);
          auVar185._8_4_ = 0x7fffffff;
          auVar185._0_8_ = 0x7fffffff7fffffff;
          auVar185._12_4_ = 0x7fffffff;
          auVar75 = vandps_avx(auVar80,auVar185);
          auVar74 = vandps_avx(auVar68,auVar185);
          auVar75 = vmaxps_avx(auVar75,auVar74);
          auVar74 = vmovshdup_avx(auVar75);
          auVar74 = vmaxss_avx(auVar74,auVar75);
          auVar75 = vshufpd_avx(auVar75,auVar75,1);
          auVar75 = vmaxss_avx(auVar75,auVar74);
          fVar243 = auVar75._0_4_ * 1.9073486e-06;
          local_4d0 = vshufps_avx(auVar68,auVar68,0xff);
          local_3a0 = (float)local_5c0._0_4_ + local_2e0._0_4_;
          fStack_39c = (float)local_5c0._4_4_ + local_2e0._4_4_;
          fStack_398 = fStack_5b8 + local_2e0._8_4_;
          fStack_394 = fStack_5b4 + local_2e0._12_4_;
          fStack_390 = fStack_5b0 + local_2e0._16_4_;
          fStack_38c = fStack_5ac + local_2e0._20_4_;
          fStack_388 = fStack_5a8 + local_2e0._24_4_;
          fStack_384 = fStack_5a4 + local_2e0._28_4_;
          _local_480 = local_2e0;
          do {
            auVar83 = local_8c0;
            auVar148._8_4_ = 0x7f800000;
            auVar148._0_8_ = 0x7f8000007f800000;
            auVar148._12_4_ = 0x7f800000;
            auVar148._16_4_ = 0x7f800000;
            auVar148._20_4_ = 0x7f800000;
            auVar148._24_4_ = 0x7f800000;
            auVar148._28_4_ = 0x7f800000;
            auVar90 = vblendmps_avx512vl(auVar148,_local_480);
            auVar119._0_4_ =
                 (uint)(bVar59 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar59 & 1) * 0x7f800000;
            bVar10 = (bool)(bVar59 >> 1 & 1);
            auVar119._4_4_ = (uint)bVar10 * auVar90._4_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar59 >> 2 & 1);
            auVar119._8_4_ = (uint)bVar10 * auVar90._8_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar59 >> 3 & 1);
            auVar119._12_4_ = (uint)bVar10 * auVar90._12_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar59 >> 4 & 1);
            auVar119._16_4_ = (uint)bVar10 * auVar90._16_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar59 >> 5 & 1);
            auVar119._20_4_ = (uint)bVar10 * auVar90._20_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar59 >> 6 & 1);
            auVar119._24_4_ = (uint)bVar10 * auVar90._24_4_ | (uint)!bVar10 * 0x7f800000;
            auVar119._28_4_ =
                 (uint)(bVar59 >> 7) * auVar90._28_4_ | (uint)!(bool)(bVar59 >> 7) * 0x7f800000;
            auVar90 = vshufps_avx(auVar119,auVar119,0xb1);
            auVar90 = vminps_avx(auVar119,auVar90);
            auVar82 = vshufpd_avx(auVar90,auVar90,5);
            auVar90 = vminps_avx(auVar90,auVar82);
            auVar82 = vpermpd_avx2(auVar90,0x4e);
            auVar90 = vminps_avx(auVar90,auVar82);
            uVar21 = vcmpps_avx512vl(auVar119,auVar90,0);
            bVar58 = (byte)uVar21 & bVar59;
            bVar11 = bVar59;
            if (bVar58 != 0) {
              bVar11 = bVar58;
            }
            iVar25 = 0;
            for (uVar66 = (uint)bVar11; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
              iVar25 = iVar25 + 1;
            }
            aVar2 = (ray->super_RayK<1>).dir.field_0;
            local_500._0_16_ = (undefined1  [16])aVar2;
            auVar75 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            if (auVar75._0_4_ < 0.0) {
              local_8c0[1] = 0;
              local_8c0[0] = bVar59;
              local_8c0._2_30_ = auVar83._2_30_;
              local_640._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar25 << 2)));
              local_760._0_16_ = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar25 << 2)));
              fVar247 = sqrtf(auVar75._0_4_);
              bVar59 = local_8c0[0];
              auVar75 = local_760._0_16_;
              auVar74 = local_640._0_16_;
            }
            else {
              auVar75 = vsqrtss_avx(auVar75,auVar75);
              fVar247 = auVar75._0_4_;
              auVar75 = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar25 << 2)));
              auVar74 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar25 << 2)));
            }
            auVar75 = vinsertps_avx(auVar75,auVar74,0x10);
            auVar250 = ZEXT1664(auVar75);
            lVar62 = 5;
            do {
              uVar128 = auVar250._0_4_;
              auVar137._4_4_ = uVar128;
              auVar137._0_4_ = uVar128;
              auVar137._8_4_ = uVar128;
              auVar137._12_4_ = uVar128;
              auVar74 = vfmadd132ps_fma(auVar137,ZEXT816(0) << 0x40,local_500._0_16_);
              local_520._0_16_ = auVar250._0_16_;
              auVar75 = vmovshdup_avx(auVar250._0_16_);
              fVar213 = auVar75._0_4_;
              fVar212 = 1.0 - fVar213;
              fVar211 = fVar212 * fVar212 * fVar212;
              fVar248 = fVar213 * fVar213;
              fVar225 = fVar248 * fVar213;
              auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar211),
                                        ZEXT416((uint)fVar225));
              fVar249 = fVar213 * fVar212;
              local_640._0_16_ = ZEXT416((uint)fVar212);
              local_8c0._0_16_ = auVar75;
              auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar249 * fVar213 * 6.0)),
                                        ZEXT416((uint)(fVar249 * fVar212)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar225),
                                        ZEXT416((uint)fVar211));
              auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar249 * fVar212 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar249 * fVar213)));
              fVar211 = fVar211 * 0.16666667;
              fVar212 = (auVar68._0_4_ + auVar80._0_4_) * 0.16666667;
              fVar213 = (auVar75._0_4_ + auVar79._0_4_) * 0.16666667;
              fVar225 = fVar225 * 0.16666667;
              auVar186._0_4_ = fVar225 * (float)local_5a0._0_4_;
              auVar186._4_4_ = fVar225 * (float)local_5a0._4_4_;
              auVar186._8_4_ = fVar225 * fStack_598;
              auVar186._12_4_ = fVar225 * fStack_594;
              auVar219._4_4_ = fVar213;
              auVar219._0_4_ = fVar213;
              auVar219._8_4_ = fVar213;
              auVar219._12_4_ = fVar213;
              auVar75 = vfmadd132ps_fma(auVar219,auVar186,local_560._0_16_);
              auVar187._4_4_ = fVar212;
              auVar187._0_4_ = fVar212;
              auVar187._8_4_ = fVar212;
              auVar187._12_4_ = fVar212;
              auVar75 = vfmadd132ps_fma(auVar187,auVar75,local_580._0_16_);
              auVar163._4_4_ = fVar211;
              auVar163._0_4_ = fVar211;
              auVar163._8_4_ = fVar211;
              auVar163._12_4_ = fVar211;
              auVar75 = vfmadd132ps_fma(auVar163,auVar75,local_540._0_16_);
              local_400._0_16_ = auVar75;
              auVar75 = vsubps_avx(auVar74,auVar75);
              local_760._0_16_ = auVar75;
              auVar75 = vdpps_avx(auVar75,auVar75,0x7f);
              local_5e0._0_16_ = auVar75;
              if (auVar75._0_4_ < 0.0) {
                local_680._0_4_ = fVar248;
                local_6a0._0_4_ = fVar249;
                auVar259._0_4_ = sqrtf(auVar75._0_4_);
                auVar259._4_60_ = extraout_var_00;
                auVar75 = auVar259._0_16_;
                fVar249 = (float)local_6a0._0_4_;
              }
              else {
                auVar75 = vsqrtss_avx(auVar75,auVar75);
                local_680._0_4_ = fVar248;
              }
              local_420._4_4_ = local_640._0_4_;
              local_420._0_4_ = local_420._4_4_;
              fStack_418 = (float)local_420._4_4_;
              fStack_414 = (float)local_420._4_4_;
              auVar68 = vfnmsub213ss_fma(local_8c0._0_16_,local_8c0._0_16_,
                                         ZEXT416((uint)(fVar249 * 4.0)));
              auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar249 * 4.0)),local_640._0_16_,
                                        local_640._0_16_);
              fVar248 = (float)local_420._4_4_ * -(float)local_420._4_4_ * 0.5;
              fVar249 = auVar68._0_4_ * 0.5;
              fVar211 = auVar74._0_4_ * 0.5;
              local_680._0_4_ = (float)local_680._0_4_ * 0.5;
              auVar204._0_4_ = (float)local_680._0_4_ * (float)local_5a0._0_4_;
              auVar204._4_4_ = (float)local_680._0_4_ * (float)local_5a0._4_4_;
              auVar204._8_4_ = (float)local_680._0_4_ * fStack_598;
              auVar204._12_4_ = (float)local_680._0_4_ * fStack_594;
              auVar164._4_4_ = fVar211;
              auVar164._0_4_ = fVar211;
              auVar164._8_4_ = fVar211;
              auVar164._12_4_ = fVar211;
              auVar74 = vfmadd132ps_fma(auVar164,auVar204,local_560._0_16_);
              auVar188._4_4_ = fVar249;
              auVar188._0_4_ = fVar249;
              auVar188._8_4_ = fVar249;
              auVar188._12_4_ = fVar249;
              auVar74 = vfmadd132ps_fma(auVar188,auVar74,local_580._0_16_);
              auVar258._4_4_ = fVar248;
              auVar258._0_4_ = fVar248;
              auVar258._8_4_ = fVar248;
              auVar258._12_4_ = fVar248;
              _local_680 = vfmadd132ps_fma(auVar258,auVar74,local_540._0_16_);
              local_440._0_16_ = vdpps_avx(_local_680,_local_680,0x7f);
              auVar52._12_4_ = 0;
              auVar52._0_12_ = ZEXT812(0);
              fVar248 = local_440._0_4_;
              _local_890 = vrsqrt14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar248));
              fVar249 = local_890._0_4_;
              local_460._0_16_ = vrcp14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar248));
              auVar74 = vfnmadd213ss_fma(local_460._0_16_,local_440._0_16_,ZEXT416(0x40000000));
              local_6a0._0_4_ = auVar75._0_4_;
              if (fVar248 < -fVar248) {
                local_8a0._0_4_ = fVar248 * -0.5;
                fVar211 = sqrtf(fVar248);
                auVar75 = ZEXT416((uint)local_6a0._0_4_);
                fVar248 = (float)local_8a0._0_4_;
                auVar68 = _local_680;
              }
              else {
                auVar68 = vsqrtss_avx(local_440._0_16_,local_440._0_16_);
                fVar211 = auVar68._0_4_;
                fVar248 = fVar248 * -0.5;
                auVar68 = _local_680;
              }
              fVar212 = local_890._0_4_;
              local_890._4_4_ = fVar249 * 1.5 + fVar248 * fVar212 * fVar212 * fVar212;
              local_890._0_4_ = local_890._4_4_;
              fStack_888 = (float)local_890._4_4_;
              fStack_884 = (float)local_890._4_4_;
              auVar261._0_4_ = auVar68._0_4_ * (float)local_890._4_4_;
              auVar261._4_4_ = auVar68._4_4_ * (float)local_890._4_4_;
              auVar261._8_4_ = auVar68._8_4_ * (float)local_890._4_4_;
              auVar261._12_4_ = auVar68._12_4_ * (float)local_890._4_4_;
              auVar80 = vdpps_avx(local_760._0_16_,auVar261,0x7f);
              fVar249 = auVar75._0_4_;
              auVar138._0_4_ = auVar80._0_4_ * auVar80._0_4_;
              auVar138._4_4_ = auVar80._4_4_ * auVar80._4_4_;
              auVar138._8_4_ = auVar80._8_4_ * auVar80._8_4_;
              auVar138._12_4_ = auVar80._12_4_ * auVar80._12_4_;
              auVar79 = vsubps_avx(local_5e0._0_16_,auVar138);
              fVar248 = auVar79._0_4_;
              auVar165._4_12_ = ZEXT812(0) << 0x20;
              auVar165._0_4_ = fVar248;
              auVar69 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar165);
              auVar76 = vmulss_avx512f(auVar69,ZEXT416(0x3fc00000));
              auVar77 = vmulss_avx512f(auVar79,ZEXT416(0xbf000000));
              if (fVar248 < 0.0) {
                local_4c0 = auVar77._0_4_;
                local_8a0 = auVar80;
                local_4b0 = auVar261;
                local_4a0 = auVar69;
                fVar248 = sqrtf(fVar248);
                auVar77 = ZEXT416((uint)local_4c0);
                auVar76 = ZEXT416(auVar76._0_4_);
                auVar75 = ZEXT416((uint)local_6a0._0_4_);
                auVar69 = local_4a0;
                auVar68 = _local_680;
                auVar80 = local_8a0;
                auVar261 = local_4b0;
              }
              else {
                auVar79 = vsqrtss_avx(auVar79,auVar79);
                fVar248 = auVar79._0_4_;
              }
              auVar259 = ZEXT1664(auVar68);
              auVar256 = ZEXT1664(local_5e0._0_16_);
              auVar270 = ZEXT3264(local_660);
              auVar268 = ZEXT3264(local_780);
              auVar262 = ZEXT3264(local_7a0);
              auVar263 = ZEXT3264(local_7c0);
              auVar264 = ZEXT3264(local_6c0);
              auVar265 = ZEXT3264(local_7e0);
              auVar266 = ZEXT3264(local_6e0);
              auVar267 = ZEXT3264(local_800);
              auVar269 = ZEXT3264(local_820);
              auVar271 = ZEXT3264(local_700);
              auVar272 = ZEXT3264(local_720);
              auVar273 = ZEXT3264(local_740);
              auVar274 = ZEXT3264(local_840);
              auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_640._0_16_,
                                        local_8c0._0_16_);
              auVar19 = vfmadd213ss_fma(local_8c0._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                        local_640._0_16_);
              auVar79 = vshufps_avx(local_520._0_16_,local_520._0_16_,0x55);
              auVar189._0_4_ = auVar79._0_4_ * (float)local_5a0._0_4_;
              auVar189._4_4_ = auVar79._4_4_ * (float)local_5a0._4_4_;
              auVar189._8_4_ = auVar79._8_4_ * fStack_598;
              auVar189._12_4_ = auVar79._12_4_ * fStack_594;
              auVar205._0_4_ = auVar19._0_4_;
              auVar205._4_4_ = auVar205._0_4_;
              auVar205._8_4_ = auVar205._0_4_;
              auVar205._12_4_ = auVar205._0_4_;
              auVar79 = vfmadd132ps_fma(auVar205,auVar189,local_560._0_16_);
              auVar166._0_4_ = auVar70._0_4_;
              auVar166._4_4_ = auVar166._0_4_;
              auVar166._8_4_ = auVar166._0_4_;
              auVar166._12_4_ = auVar166._0_4_;
              auVar79 = vfmadd132ps_fma(auVar166,auVar79,local_580._0_16_);
              auVar79 = vfmadd132ps_fma(_local_420,auVar79,local_540._0_16_);
              auVar167._0_4_ = auVar79._0_4_ * (float)local_440._0_4_;
              auVar167._4_4_ = auVar79._4_4_ * (float)local_440._0_4_;
              auVar167._8_4_ = auVar79._8_4_ * (float)local_440._0_4_;
              auVar167._12_4_ = auVar79._12_4_ * (float)local_440._0_4_;
              auVar79 = vdpps_avx(auVar68,auVar79,0x7f);
              fVar212 = auVar79._0_4_;
              auVar190._0_4_ = auVar68._0_4_ * fVar212;
              auVar190._4_4_ = auVar68._4_4_ * fVar212;
              auVar190._8_4_ = auVar68._8_4_ * fVar212;
              auVar190._12_4_ = auVar68._12_4_ * fVar212;
              auVar79 = vsubps_avx(auVar167,auVar190);
              fVar212 = auVar74._0_4_ * (float)local_460._0_4_;
              auVar70 = vmaxss_avx(ZEXT416((uint)fVar243),
                                   ZEXT416((uint)(local_520._0_4_ * fVar247 * 1.9073486e-06)));
              auVar34._8_4_ = 0x80000000;
              auVar34._0_8_ = 0x8000000080000000;
              auVar34._12_4_ = 0x80000000;
              auVar78 = vxorps_avx512vl(auVar68,auVar34);
              auVar191._0_4_ = auVar79._0_4_ * fVar212 * (float)local_890._0_4_;
              auVar191._4_4_ = auVar79._4_4_ * fVar212 * (float)local_890._4_4_;
              auVar191._8_4_ = auVar79._8_4_ * fVar212 * fStack_888;
              auVar191._12_4_ = auVar79._12_4_ * fVar212 * fStack_884;
              auVar74 = vdpps_avx(auVar78,auVar261,0x7f);
              auVar79 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar243),auVar70);
              auVar75 = vdpps_avx(local_760._0_16_,auVar191,0x7f);
              auVar19 = vfmadd213ss_fma(ZEXT416((uint)(fVar249 + 1.0)),
                                        ZEXT416((uint)(fVar243 / fVar211)),auVar79);
              fVar249 = auVar74._0_4_ + auVar75._0_4_;
              auVar75 = vdpps_avx(local_500._0_16_,auVar261,0x7f);
              auVar74 = vdpps_avx(local_760._0_16_,auVar78,0x7f);
              auVar79 = vmulss_avx512f(auVar77,auVar69);
              auVar77 = vaddss_avx512f(auVar76,ZEXT416((uint)(auVar79._0_4_ *
                                                             auVar69._0_4_ * auVar69._0_4_)));
              auVar79 = vdpps_avx(local_760._0_16_,local_500._0_16_,0x7f);
              auVar76 = vfnmadd231ss_fma(auVar74,auVar80,ZEXT416((uint)fVar249));
              auVar79 = vfnmadd231ss_fma(auVar79,auVar80,auVar75);
              auVar74 = vpermilps_avx(local_400._0_16_,0xff);
              fVar248 = fVar248 - auVar74._0_4_;
              auVar69 = vshufps_avx(auVar68,auVar68,0xff);
              auVar74 = vfmsub213ss_fma(auVar76,auVar77,auVar69);
              auVar239._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
              auVar239._8_4_ = auVar74._8_4_ ^ 0x80000000;
              auVar239._12_4_ = auVar74._12_4_ ^ 0x80000000;
              auVar242 = ZEXT1664(auVar239);
              auVar79 = ZEXT416((uint)(auVar79._0_4_ * auVar77._0_4_));
              auVar76 = vfmsub231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar74._0_4_)),
                                        ZEXT416((uint)fVar249),auVar79);
              auVar74 = vinsertps_avx(auVar239,auVar79,0x1c);
              auVar231._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
              auVar231._8_4_ = auVar75._8_4_ ^ 0x80000000;
              auVar231._12_4_ = auVar75._12_4_ ^ 0x80000000;
              auVar79 = vinsertps_avx(ZEXT416((uint)fVar249),auVar231,0x10);
              auVar206._0_4_ = auVar76._0_4_;
              auVar206._4_4_ = auVar206._0_4_;
              auVar206._8_4_ = auVar206._0_4_;
              auVar206._12_4_ = auVar206._0_4_;
              auVar75 = vdivps_avx(auVar74,auVar206);
              auVar74 = vdivps_avx(auVar79,auVar206);
              fVar249 = auVar80._0_4_;
              auVar232 = ZEXT1664(CONCAT412(fVar248,CONCAT48(fVar248,CONCAT44(fVar248,fVar248))));
              auVar207._0_4_ = fVar249 * auVar75._0_4_ + fVar248 * auVar74._0_4_;
              auVar207._4_4_ = fVar249 * auVar75._4_4_ + fVar248 * auVar74._4_4_;
              auVar207._8_4_ = fVar249 * auVar75._8_4_ + fVar248 * auVar74._8_4_;
              auVar207._12_4_ = fVar249 * auVar75._12_4_ + fVar248 * auVar74._12_4_;
              auVar75 = vsubps_avx(local_520._0_16_,auVar207);
              auVar250 = ZEXT1664(auVar75);
              auVar35._8_4_ = 0x7fffffff;
              auVar35._0_8_ = 0x7fffffff7fffffff;
              auVar35._12_4_ = 0x7fffffff;
              auVar74 = vandps_avx512vl(auVar80,auVar35);
              if (auVar74._0_4_ < auVar19._0_4_) {
                auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ + auVar70._0_4_)),local_4d0,
                                          ZEXT416(0x36000000));
                auVar36._8_4_ = 0x7fffffff;
                auVar36._0_8_ = 0x7fffffff7fffffff;
                auVar36._12_4_ = 0x7fffffff;
                auVar80 = vandps_avx512vl(ZEXT416((uint)fVar248),auVar36);
                if (auVar80._0_4_ < auVar74._0_4_) {
                  fVar247 = auVar75._0_4_ + (float)local_4e0._0_4_;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar247) &&
                     (fVar248 = (ray->super_RayK<1>).tfar, fVar247 <= fVar248)) {
                    auVar74 = vmovshdup_avx(auVar75);
                    fVar249 = auVar74._0_4_;
                    if ((0.0 <= fVar249) && (fVar249 <= 1.0)) {
                      auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_5e0._0_4_)
                                                  );
                      fVar212 = auVar74._0_4_;
                      fVar211 = local_5e0._0_4_ * -0.5;
                      auVar232 = ZEXT464((uint)fVar211);
                      pGVar5 = (context->scene->geometries).items[local_8d0].ptr;
                      if ((pGVar5->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar211 = fVar212 * 1.5 + fVar211 * fVar212 * fVar212 * fVar212;
                        auVar208._0_4_ = local_760._0_4_ * fVar211;
                        auVar208._4_4_ = local_760._4_4_ * fVar211;
                        auVar208._8_4_ = local_760._8_4_ * fVar211;
                        auVar208._12_4_ = local_760._12_4_ * fVar211;
                        auVar69 = vfmadd213ps_fma(auVar69,auVar208,auVar68);
                        auVar74 = vshufps_avx(auVar208,auVar208,0xc9);
                        auVar80 = vshufps_avx(auVar68,auVar68,0xc9);
                        auVar209._0_4_ = auVar208._0_4_ * auVar80._0_4_;
                        auVar209._4_4_ = auVar208._4_4_ * auVar80._4_4_;
                        auVar209._8_4_ = auVar208._8_4_ * auVar80._8_4_;
                        auVar209._12_4_ = auVar208._12_4_ * auVar80._12_4_;
                        auVar79 = vfmsub231ps_fma(auVar209,auVar68,auVar74);
                        auVar74 = vshufps_avx(auVar79,auVar79,0xc9);
                        auVar80 = vshufps_avx(auVar69,auVar69,0xc9);
                        auVar232 = ZEXT1664(auVar80);
                        auVar79 = vshufps_avx(auVar79,auVar79,0xd2);
                        auVar139._0_4_ = auVar69._0_4_ * auVar79._0_4_;
                        auVar139._4_4_ = auVar69._4_4_ * auVar79._4_4_;
                        auVar139._8_4_ = auVar69._8_4_ * auVar79._8_4_;
                        auVar139._12_4_ = auVar69._12_4_ * auVar79._12_4_;
                        auVar74 = vfmsub231ps_fma(auVar139,auVar74,auVar80);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar247;
                          auVar75 = vshufps_avx(auVar74,auVar74,0xe9);
                          uVar21 = vmovlps_avx(auVar75);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar21;
                          (ray->Ng).field_0.field_0.z = auVar74._0_4_;
                          ray->u = fVar249;
                          ray->v = 0.0;
                          ray->primID = (uint)local_8c8;
                          ray->geomID = (uint)local_8d0;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          local_8c0._0_4_ = fVar248;
                          auVar79 = vshufps_avx(auVar74,auVar74,0xe9);
                          local_610 = vmovlps_avx(auVar79);
                          local_608 = auVar74._0_4_;
                          local_604 = fVar249;
                          local_600 = 0;
                          local_5fc = (uint)local_8c8;
                          local_5f8 = (uint)local_8d0;
                          local_5f4 = context->user->instID[0];
                          local_5f0 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar247;
                          local_8d8 = -1;
                          local_880.valid = &local_8d8;
                          local_880.geometryUserPtr = pGVar5->userPtr;
                          local_880.context = context->user;
                          local_880.ray = (RTCRayN *)ray;
                          local_880.hit = (RTCHitN *)&local_610;
                          local_880.N = 1;
                          if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b9b517:
                            p_Var9 = context->args->filter;
                            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar232 = ZEXT1664(auVar232._0_16_);
                              auVar242 = ZEXT1664(auVar242._0_16_);
                              auVar250 = ZEXT1664(auVar250._0_16_);
                              auVar256 = ZEXT1664(auVar256._0_16_);
                              auVar259 = ZEXT1664(auVar259._0_16_);
                              (*p_Var9)(&local_880);
                              auVar274 = ZEXT3264(local_840);
                              auVar273 = ZEXT3264(local_740);
                              auVar272 = ZEXT3264(local_720);
                              auVar271 = ZEXT3264(local_700);
                              auVar269 = ZEXT3264(local_820);
                              auVar267 = ZEXT3264(local_800);
                              auVar266 = ZEXT3264(local_6e0);
                              auVar265 = ZEXT3264(local_7e0);
                              auVar264 = ZEXT3264(local_6c0);
                              auVar263 = ZEXT3264(local_7c0);
                              auVar262 = ZEXT3264(local_7a0);
                              auVar268 = ZEXT3264(local_780);
                              auVar270 = ZEXT3264(local_660);
                              if (*local_880.valid == 0) goto LAB_01b9b61d;
                            }
                            (((Vec3f *)((long)local_880.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_880.hit;
                            (((Vec3f *)((long)local_880.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_880.hit + 4);
                            (((Vec3f *)((long)local_880.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_880.hit + 8);
                            *(float *)((long)local_880.ray + 0x3c) = *(float *)(local_880.hit + 0xc)
                            ;
                            *(float *)((long)local_880.ray + 0x40) =
                                 *(float *)(local_880.hit + 0x10);
                            *(float *)((long)local_880.ray + 0x44) =
                                 *(float *)(local_880.hit + 0x14);
                            *(float *)((long)local_880.ray + 0x48) =
                                 *(float *)(local_880.hit + 0x18);
                            *(float *)((long)local_880.ray + 0x4c) =
                                 *(float *)(local_880.hit + 0x1c);
                            *(float *)((long)local_880.ray + 0x50) =
                                 *(float *)(local_880.hit + 0x20);
                          }
                          else {
                            auVar232 = ZEXT1664(auVar80);
                            auVar242 = ZEXT1664(auVar239);
                            auVar250 = ZEXT1664(auVar75);
                            auVar256 = ZEXT1664(local_5e0._0_16_);
                            auVar259 = ZEXT1664(auVar68);
                            (*pGVar5->intersectionFilterN)(&local_880);
                            auVar274 = ZEXT3264(local_840);
                            auVar273 = ZEXT3264(local_740);
                            auVar272 = ZEXT3264(local_720);
                            auVar271 = ZEXT3264(local_700);
                            auVar269 = ZEXT3264(local_820);
                            auVar267 = ZEXT3264(local_800);
                            auVar266 = ZEXT3264(local_6e0);
                            auVar265 = ZEXT3264(local_7e0);
                            auVar264 = ZEXT3264(local_6c0);
                            auVar263 = ZEXT3264(local_7c0);
                            auVar262 = ZEXT3264(local_7a0);
                            auVar268 = ZEXT3264(local_780);
                            auVar270 = ZEXT3264(local_660);
                            if (*local_880.valid != 0) goto LAB_01b9b517;
LAB_01b9b61d:
                            (ray->super_RayK<1>).tfar = (float)local_8c0._0_4_;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar62 = lVar62 + -1;
            } while (lVar62 != 0);
            fVar247 = (ray->super_RayK<1>).tfar;
            auVar147._4_4_ = fVar247;
            auVar147._0_4_ = fVar247;
            auVar147._8_4_ = fVar247;
            auVar147._12_4_ = fVar247;
            auVar147._16_4_ = fVar247;
            auVar147._20_4_ = fVar247;
            auVar147._24_4_ = fVar247;
            auVar147._28_4_ = fVar247;
            auVar56._4_4_ = fStack_39c;
            auVar56._0_4_ = local_3a0;
            auVar56._8_4_ = fStack_398;
            auVar56._12_4_ = fStack_394;
            auVar56._16_4_ = fStack_390;
            auVar56._20_4_ = fStack_38c;
            auVar56._24_4_ = fStack_388;
            auVar56._28_4_ = fStack_384;
            uVar21 = vcmpps_avx512vl(auVar147,auVar56,0xd);
            bVar59 = ~('\x01' << ((byte)iVar25 & 0x1f)) & bVar59 & (byte)uVar21;
          } while (bVar59 != 0);
          fVar243 = (float)local_5c0._0_4_;
          fVar247 = (float)local_5c0._4_4_;
          fVar248 = fStack_5b8;
          fVar249 = fStack_5b4;
          fVar211 = fStack_5b0;
          fVar212 = fStack_5ac;
          fVar213 = fStack_5a8;
          fVar225 = fStack_5a4;
        }
        uVar22 = vpcmpgtd_avx512vl(local_3e0,local_360);
        uVar24 = vpcmpd_avx512vl(local_360,local_2a0,1);
        auVar192._0_4_ = fVar243 + (float)local_320._0_4_;
        auVar192._4_4_ = fVar247 + (float)local_320._4_4_;
        auVar192._8_4_ = fVar248 + fStack_318;
        auVar192._12_4_ = fVar249 + fStack_314;
        auVar192._16_4_ = fVar211 + fStack_310;
        auVar192._20_4_ = fVar212 + fStack_30c;
        auVar192._24_4_ = fVar213 + fStack_308;
        auVar192._28_4_ = fVar225 + fStack_304;
        uVar21 = vcmpps_avx512vl(auVar192,auVar147,2);
        bVar59 = (byte)local_848 & (byte)uVar24 & (byte)uVar21;
        auVar193._0_4_ = fVar243 + local_2e0._0_4_;
        auVar193._4_4_ = fVar247 + local_2e0._4_4_;
        auVar193._8_4_ = fVar248 + local_2e0._8_4_;
        auVar193._12_4_ = fVar249 + local_2e0._12_4_;
        auVar193._16_4_ = fVar211 + local_2e0._16_4_;
        auVar193._20_4_ = fVar212 + local_2e0._20_4_;
        auVar193._24_4_ = fVar213 + local_2e0._24_4_;
        auVar193._28_4_ = fVar225 + local_2e0._28_4_;
        uVar21 = vcmpps_avx512vl(auVar193,auVar147,2);
        bVar57 = bVar57 & (byte)uVar22 & (byte)uVar21 | bVar59;
        auVar246 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        prim = local_488;
        if (bVar57 != 0) {
          uVar65 = (ulong)uVar60;
          abStack_180[uVar65 * 0x60] = bVar57;
          bVar10 = (bool)(bVar59 >> 1 & 1);
          bVar12 = (bool)(bVar59 >> 2 & 1);
          bVar13 = (bool)(bVar59 >> 3 & 1);
          bVar14 = (bool)(bVar59 >> 4 & 1);
          bVar15 = (bool)(bVar59 >> 5 & 1);
          bVar16 = (bool)(bVar59 >> 6 & 1);
          auStack_160[uVar65 * 0x18] =
               (uint)(bVar59 & 1) * local_320._0_4_ |
               (uint)!(bool)(bVar59 & 1) * (int)local_2e0._0_4_;
          auStack_160[uVar65 * 0x18 + 1] =
               (uint)bVar10 * local_320._4_4_ | (uint)!bVar10 * (int)local_2e0._4_4_;
          auStack_160[uVar65 * 0x18 + 2] =
               (uint)bVar12 * (int)fStack_318 | (uint)!bVar12 * (int)local_2e0._8_4_;
          auStack_160[uVar65 * 0x18 + 3] =
               (uint)bVar13 * (int)fStack_314 | (uint)!bVar13 * (int)local_2e0._12_4_;
          auStack_160[uVar65 * 0x18 + 4] =
               (uint)bVar14 * (int)fStack_310 | (uint)!bVar14 * (int)local_2e0._16_4_;
          auStack_160[uVar65 * 0x18 + 5] =
               (uint)bVar15 * (int)fStack_30c | (uint)!bVar15 * (int)local_2e0._20_4_;
          auStack_160[uVar65 * 0x18 + 6] =
               (uint)bVar16 * (int)fStack_308 | (uint)!bVar16 * (int)local_2e0._24_4_;
          auStack_160[uVar65 * 0x18 + 7] =
               (uint)(bVar59 >> 7) * (int)fStack_304 |
               (uint)!(bool)(bVar59 >> 7) * (int)local_2e0._28_4_;
          uVar64 = vmovlps_avx(local_370);
          (&uStack_140)[uVar65 * 0xc] = uVar64;
          aiStack_138[uVar65 * 0x18] = local_844 + 1;
          uVar60 = uVar60 + 1;
        }
      }
    }
    fVar222 = (ray->super_RayK<1>).tfar;
    fVar214 = (ray->super_RayK<1>).tfar;
    auVar168._4_4_ = fVar214;
    auVar168._0_4_ = fVar214;
    auVar168._8_4_ = fVar214;
    auVar168._12_4_ = fVar214;
    auVar168._16_4_ = fVar214;
    auVar168._20_4_ = fVar214;
    auVar168._24_4_ = fVar214;
    auVar168._28_4_ = fVar214;
    do {
      uVar66 = uVar60;
      uVar120 = uVar66 - 1;
      if (uVar66 == 0) {
        auVar140._4_4_ = fVar222;
        auVar140._0_4_ = fVar222;
        auVar140._8_4_ = fVar222;
        auVar140._12_4_ = fVar222;
        uVar21 = vcmpps_avx512vl(auVar140,local_380,0xd);
        uVar60 = (uint)uVar21 & (uint)uVar63 - 1 & (uint)uVar63;
        uVar63 = (ulong)uVar60;
        if (uVar60 == 0) {
          return;
        }
        goto LAB_01b98f0f;
      }
      uVar64 = (ulong)uVar120;
      auVar90 = *(undefined1 (*) [32])(auStack_160 + uVar64 * 0x18);
      auVar210._0_4_ = fVar243 + auVar90._0_4_;
      auVar210._4_4_ = fVar247 + auVar90._4_4_;
      auVar210._8_4_ = fVar248 + auVar90._8_4_;
      auVar210._12_4_ = fVar249 + auVar90._12_4_;
      auVar210._16_4_ = fVar211 + auVar90._16_4_;
      auVar210._20_4_ = fVar212 + auVar90._20_4_;
      auVar210._24_4_ = fVar213 + auVar90._24_4_;
      auVar210._28_4_ = fVar225 + auVar90._28_4_;
      uVar21 = vcmpps_avx512vl(auVar210,auVar168,2);
      uVar121 = (uint)uVar21 & (uint)abStack_180[uVar64 * 0x60];
      uVar60 = uVar120;
    } while (uVar121 == 0);
    uVar65 = (&uStack_140)[uVar64 * 0xc];
    auVar133._8_8_ = 0;
    auVar133._0_8_ = uVar65;
    auVar169._8_4_ = 0x7f800000;
    auVar169._0_8_ = 0x7f8000007f800000;
    auVar169._12_4_ = 0x7f800000;
    auVar169._16_4_ = 0x7f800000;
    auVar169._20_4_ = 0x7f800000;
    auVar169._24_4_ = 0x7f800000;
    auVar169._28_4_ = 0x7f800000;
    auVar90 = vblendmps_avx512vl(auVar169,auVar90);
    bVar57 = (byte)uVar121;
    auVar117._0_4_ = (uint)(bVar57 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar57 & 1) * 0x7f800000;
    bVar10 = (bool)((byte)(uVar121 >> 1) & 1);
    auVar117._4_4_ = (uint)bVar10 * auVar90._4_4_ | (uint)!bVar10 * 0x7f800000;
    bVar10 = (bool)((byte)(uVar121 >> 2) & 1);
    auVar117._8_4_ = (uint)bVar10 * auVar90._8_4_ | (uint)!bVar10 * 0x7f800000;
    bVar10 = (bool)((byte)(uVar121 >> 3) & 1);
    auVar117._12_4_ = (uint)bVar10 * auVar90._12_4_ | (uint)!bVar10 * 0x7f800000;
    bVar10 = (bool)((byte)(uVar121 >> 4) & 1);
    auVar117._16_4_ = (uint)bVar10 * auVar90._16_4_ | (uint)!bVar10 * 0x7f800000;
    bVar10 = (bool)((byte)(uVar121 >> 5) & 1);
    auVar117._20_4_ = (uint)bVar10 * auVar90._20_4_ | (uint)!bVar10 * 0x7f800000;
    bVar10 = (bool)((byte)(uVar121 >> 6) & 1);
    auVar117._24_4_ = (uint)bVar10 * auVar90._24_4_ | (uint)!bVar10 * 0x7f800000;
    auVar117._28_4_ = (uVar121 >> 7) * auVar90._28_4_ | (uint)!SUB41(uVar121 >> 7,0) * 0x7f800000;
    auVar90 = vshufps_avx(auVar117,auVar117,0xb1);
    auVar90 = vminps_avx(auVar117,auVar90);
    auVar82 = vshufpd_avx(auVar90,auVar90,5);
    auVar90 = vminps_avx(auVar90,auVar82);
    auVar82 = vpermpd_avx2(auVar90,0x4e);
    auVar90 = vminps_avx(auVar90,auVar82);
    uVar21 = vcmpps_avx512vl(auVar117,auVar90,0);
    bVar59 = (byte)uVar21 & bVar57;
    if (bVar59 != 0) {
      uVar121 = (uint)bVar59;
    }
    uVar122 = 0;
    for (; (uVar121 & 1) == 0; uVar121 = uVar121 >> 1 | 0x80000000) {
      uVar122 = uVar122 + 1;
    }
    local_844 = aiStack_138[uVar64 * 0x18];
    bVar57 = ~('\x01' << ((byte)uVar122 & 0x1f)) & bVar57;
    abStack_180[uVar64 * 0x60] = bVar57;
    uVar60 = uVar66;
    if (bVar57 == 0) {
      uVar60 = uVar120;
    }
    uVar128 = (undefined4)uVar65;
    auVar170._4_4_ = uVar128;
    auVar170._0_4_ = uVar128;
    auVar170._8_4_ = uVar128;
    auVar170._12_4_ = uVar128;
    auVar170._16_4_ = uVar128;
    auVar170._20_4_ = uVar128;
    auVar170._24_4_ = uVar128;
    auVar170._28_4_ = uVar128;
    auVar75 = vmovshdup_avx(auVar133);
    auVar75 = vsubps_avx(auVar75,auVar133);
    auVar143._0_4_ = auVar75._0_4_;
    auVar143._4_4_ = auVar143._0_4_;
    auVar143._8_4_ = auVar143._0_4_;
    auVar143._12_4_ = auVar143._0_4_;
    auVar143._16_4_ = auVar143._0_4_;
    auVar143._20_4_ = auVar143._0_4_;
    auVar143._24_4_ = auVar143._0_4_;
    auVar143._28_4_ = auVar143._0_4_;
    auVar75 = vfmadd132ps_fma(auVar143,auVar170,_DAT_01faff20);
    _local_320 = ZEXT1632(auVar75);
    local_370._8_8_ = 0;
    local_370._0_8_ = *(ulong *)(local_320 + (ulong)uVar122 * 4);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }